

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::compileInterface
          (NodeTranslator *this,Reader decl,Reader members,Builder builder)

{
  Reader *decl_00;
  short sVar1;
  ErrorReporter *pEVar2;
  long lVar3;
  Arena *pAVar4;
  _func_int **pp_Var5;
  _Base_ptr p_Var6;
  Builder target;
  Builder builder_00;
  Builder target_00;
  Builder target_01;
  Builder builder_01;
  Builder target_02;
  Builder target_03;
  Reader source;
  Reader ordinal;
  Reader params_00;
  Reader source_00;
  undefined1 auVar7 [40];
  Reader source_01;
  Reader params_01;
  Reader source_02;
  Reader source_03;
  Reader annotations;
  ImplicitParams implicitMethodParams;
  Reader name;
  Reader name_00;
  undefined8 uVar8;
  undefined8 *puVar9;
  undefined1 auVar10 [56];
  undefined1 auVar11 [56];
  ListElementCount LVar12;
  BrandScope *pBVar13;
  char cVar14;
  char cVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  short sVar18;
  undefined4 uVar19;
  bool bVar20;
  ulong uVar21;
  uint64_t uVar22;
  BrandScope *pBVar23;
  undefined8 uVar24;
  _Base_ptr p_Var25;
  uint uVar26;
  char **ppcVar27;
  size_t sVar28;
  undefined4 uVar29;
  char *pcVar30;
  SegmentBuilder *pSVar31;
  BrandedDecl *pBVar32;
  uint16_t methodOrdinal;
  long lVar33;
  uint uVar34;
  String *in_R8;
  ElementCount EVar35;
  unsigned_long i;
  ulong uVar36;
  ulong uVar37;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  StringPtr message_03;
  StringPtr message_04;
  StringPtr message_05;
  StringPtr message_06;
  StringPtr message_07;
  StringPtr targetsFlagName;
  Reader RVar38;
  Reader value;
  undefined8 local_9b8;
  ulong local_9b0;
  ulong local_9a8;
  BrandScope *local_9a0;
  ArrayBuilder<capnp::compiler::BrandedDecl> implicitDecls;
  StructDataBitCount local_978;
  StructPointerCount SStack_974;
  ElementSize EStack_972;
  undefined1 uStack_971;
  undefined8 local_970;
  Reader superclass;
  BuilderFor<capnp::schema::Node> builder_1;
  ListReader local_8f8;
  Orphan<capnp::schema::Node::SourceInfo> newSourceInfo;
  ElementCount local_8a0;
  ArrayBuilder<capnp::compiler::BrandedDecl> implicitDecls_1;
  undefined8 local_878;
  Reader local_868;
  Orphanage *local_830;
  Builder bindings;
  undefined8 uStack_800;
  Vector<capnp::compiler::BrandScope_*> levels_2;
  undefined8 local_7d8;
  Vector<capnp::compiler::BrandScope_*> levels;
  uint local_7a8;
  BuilderFor<capnp::schema::Node> builder_2;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> brand_1;
  Array<capnp::compiler::BrandedDecl> result;
  word *local_740;
  uint local_734;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> brand;
  Orphan<capnp::schema::Node> newStruct;
  undefined6 local_6f8;
  undefined2 uStack_6f2;
  Vector<capnp::compiler::BrandScope_*> levels_1;
  Builder scopes;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 uStack_688;
  StructOrGroup local_670 [5];
  Arena local_648;
  _Rb_tree_node_base local_620;
  size_t local_600;
  MemberInfo **ppMStack_5f8;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *local_5f0;
  MemberInfo **ppMStack_5e8;
  ArrayDisposer *local_5e0;
  Builder implicitBuilder;
  String typeName;
  word *local_588;
  BrandScope *local_530;
  DuplicateOrdinalDetector dupDetector;
  String typeName_1;
  NullableValue<capnp::compiler::BrandedDecl> _decl1554;
  Builder methodBuilder;
  Builder local_2f8;
  undefined1 local_2c8 [16];
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  methods;
  Reader methodReader;
  Reader implicits;
  Reader results;
  Reader params;
  Reader ordinalDecl;
  Builder sourceInfo;
  Reader local_168;
  undefined1 local_138 [16];
  Builder sourceInfoList;
  Builder list;
  Builder superclassesBuilder;
  Builder interfaceBuilder;
  Reader superclassesDecl;
  Builder implicitsBuilder;
  
  capnp::schema::Node::Builder::initInterface(&interfaceBuilder,&builder);
  Declaration::Interface::Reader::getSuperclasses(&superclassesDecl,&decl);
  capnp::schema::Node::Interface::Builder::initSuperclasses
            (&superclassesBuilder,&interfaceBuilder,superclassesDecl.reader.elementCount);
  for (uVar37 = 0; LVar12 = members.reader.elementCount,
      uVar37 != superclassesDecl.reader.elementCount; uVar37 = uVar37 + 1) {
    capnp::_::ListReader::getStructElement
              (&superclass._reader,&superclassesDecl.reader,(ElementCount)uVar37);
    dupDetector.lastOrdinalLocation.ptr.field_1._8_4_ = 0;
    dupDetector.lastOrdinalLocation.ptr.field_1._12_2_ = 0;
    dupDetector.lastOrdinalLocation.ptr.field_1._14_2_ = 0;
    dupDetector.lastOrdinalLocation.ptr.field_1._16_6_ = 0;
    dupDetector.lastOrdinalLocation.ptr.isSet = false;
    dupDetector.lastOrdinalLocation.ptr._1_7_ = 0;
    dupDetector.lastOrdinalLocation.ptr.field_1._0_6_ = 0;
    dupDetector.lastOrdinalLocation.ptr.field_1._6_2_ = 0;
    dupDetector.errorReporter = (ErrorReporter *)0x0;
    dupDetector.expectedOrdinal = 0;
    dupDetector._12_4_ = 0;
    dupDetector.lastOrdinalLocation.ptr.field_1._22_1_ = 7;
    dupDetector.lastOrdinalLocation.ptr.field_1._24_4_ = 0x7fffffff;
    implicitMethodParams.params.reader._44_4_ = dupDetector.lastOrdinalLocation.ptr.field_1._28_4_;
    implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
    implicitMethodParams.params.reader._39_1_ = dupDetector.lastOrdinalLocation.ptr.field_1._23_1_;
    implicitMethodParams.params.reader.structDataSize = 0;
    implicitMethodParams.params.reader.structPointerCount = 0;
    implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
    source._reader.capTable = superclass._reader.capTable;
    source._reader.segment = superclass._reader.segment;
    source._reader.data = superclass._reader.data;
    source._reader.pointers = superclass._reader.pointers;
    source._reader.dataSize = superclass._reader.dataSize;
    source._reader.pointerCount = superclass._reader.pointerCount;
    source._reader._38_2_ = superclass._reader._38_2_;
    source._reader.nestingLimit = superclass._reader.nestingLimit;
    source._reader._44_4_ = superclass._reader._44_4_;
    auVar7 = ZEXT1640(ZEXT816(0));
    implicitMethodParams.scopeId = auVar7._0_8_;
    implicitMethodParams.params.reader.segment = (SegmentReader *)auVar7._8_8_;
    implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar7._16_8_;
    implicitMethodParams.params.reader.ptr = (byte *)auVar7._24_8_;
    implicitMethodParams.params.reader.elementCount = auVar7._32_4_;
    implicitMethodParams.params.reader.step = auVar7._36_4_;
    BrandScope::compileDeclExpression
              ((Maybe<capnp::compiler::BrandedDecl> *)&scopes,(this->localBrand).ptr,source,
               this->resolver,implicitMethodParams);
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
              (&_decl1554,(NullableValue<capnp::compiler::BrandedDecl> *)&scopes);
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::BrandedDecl> *)&scopes);
    if (_decl1554.isSet == true) {
      BrandedDecl::getKind(&_decl1554.field_1.value);
      if ((char)scopes.builder.segment == '\x01') {
        if (scopes.builder.segment._2_2_ == 9) {
          capnp::_::ListBuilder::getStructElement
                    ((StructBuilder *)&methods,&superclassesBuilder.builder,(ElementCount)uVar37);
          uVar8 = _decl1554.field_1.value.brand.ptr;
          dupDetector.errorReporter =
               (ErrorReporter *)
               CONCAT71(dupDetector.errorReporter._1_7_,_decl1554.field_1.value.body.tag == 1);
          if (_decl1554.field_1.value.body.tag != 1) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      ((Fault *)&scopes,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                       ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                       (DebugExpression<bool> *)&dupDetector);
            kj::_::Debug::Fault::fatal((Fault *)&scopes);
          }
          levels.builder.endPtr = (BrandScope **)0x0;
          levels.builder.ptr = (BrandScope **)0x0;
          levels.builder.pos = (RemoveConst<capnp::compiler::BrandScope_*> *)0x0;
          levels.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
          local_9a0 = _decl1554.field_1.value.brand.ptr;
          uVar24 = _decl1554.field_1.value.brand.ptr;
          do {
            methodReader._reader.segment = (SegmentReader *)uVar24;
            if (((((BrandScope *)uVar24)->params).size_ != 0) ||
               ((((BrandScope *)uVar24)->inherited == true &&
                (((BrandScope *)uVar24)->leafParamCount != 0)))) {
              kj::Vector<capnp::compiler::BrandScope*>::add<capnp::compiler::BrandScope*&>
                        ((Vector<capnp::compiler::BrandScope*> *)&levels,
                         (BrandScope **)&methodReader);
            }
            uVar24 = (methodReader._reader.segment)->readLimiter;
          } while ((BrandScope *)uVar24 != (BrandScope *)0x0);
          if (levels.builder.pos != levels.builder.ptr) {
            capnp::schema::Superclass::Builder::initBrand
                      ((Builder *)&dupDetector,(Builder *)&methods);
            capnp::schema::Brand::Builder::initScopes
                      (&scopes,(Builder *)&dupDetector,
                       (uint)((ulong)((long)levels.builder.pos - (long)levels.builder.ptr) >> 3));
            local_9b0 = (long)levels.builder.pos - (long)levels.builder.ptr >> 3;
            for (uVar36 = 0; local_9a8 = uVar37, uVar36 != local_9b0; uVar36 = uVar36 + 1) {
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)&dupDetector,&scopes.builder,(ElementCount)uVar36);
              pBVar23 = levels.builder.ptr[uVar36 & 0xffffffff];
              *(uint64_t *)dupDetector.lastOrdinalLocation.ptr._0_8_ = pBVar23->leafId;
              if (pBVar23->inherited == true) {
                *(undefined2 *)(dupDetector.lastOrdinalLocation.ptr._0_8_ + 8) = 1;
              }
              else {
                capnp::schema::Brand::Scope::Builder::initBind
                          (&bindings,(Builder *)&dupDetector,(uint)(pBVar23->params).size_);
                uVar21 = bindings.builder._24_8_ & 0xffffffff;
                EVar35 = 0;
                for (lVar33 = 0; uVar21 * 0xa8 - lVar33 != 0; lVar33 = lVar33 + 0xa8) {
                  pBVar32 = (levels.builder.ptr[uVar36 & 0xffffffff]->params).ptr;
                  pEVar2 = ((BrandScope *)uVar8)->errorReporter;
                  capnp::_::ListBuilder::getStructElement
                            ((StructBuilder *)&local_868,&bindings.builder,EVar35);
                  capnp::schema::Brand::Binding::Builder::initType
                            ((Builder *)&local_8f8,(Builder *)&local_868);
                  target._builder.pointerCount = local_8f8.structPointerCount;
                  target._builder._38_1_ = local_8f8.elementSize;
                  target._builder._39_1_ = local_8f8._39_1_;
                  target._builder.dataSize = local_8f8.structDataSize;
                  target._builder.capTable._4_2_ = local_8f8.capTable._4_2_;
                  target._builder.capTable._6_1_ = local_8f8.capTable._6_1_;
                  target._builder.capTable._7_1_ = local_8f8.capTable._7_1_;
                  target._builder.capTable._0_4_ = (ListElementCount)local_8f8.capTable;
                  target._builder.data._4_4_ = local_8f8.ptr._4_4_;
                  target._builder.data._0_4_ = local_8f8.ptr._0_4_;
                  target._builder.pointers._4_4_ = local_8f8.step;
                  target._builder.pointers._0_4_ = local_8f8.elementCount;
                  target._builder.segment = (SegmentBuilder *)local_8f8.segment;
                  BrandedDecl::compileAsType
                            ((BrandedDecl *)((long)&(pBVar32->body).tag + lVar33),pEVar2,target);
                  EVar35 = EVar35 + 1;
                }
              }
            }
          }
          kj::ArrayBuilder<capnp::compiler::BrandScope_*>::dispose(&levels.builder);
          *(ulong *)methods._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               CONCAT44(_decl1554.field_1._12_4_,_decl1554.field_1._8_4_);
          goto LAB_00157138;
        }
        pEVar2 = this->errorReporter;
        BrandedDecl::toString((String *)&dupDetector,&_decl1554.field_1.value);
        kj::str<char_const(&)[2],kj::String,char_const(&)[23]>
                  ((String *)&scopes,(kj *)0x1f5394,(char (*) [2])&dupDetector,
                   (String *)"\' is not an interface.",(char (*) [23])in_R8);
        lVar33 = CONCAT44(scopes.builder.capTable._4_4_,scopes.builder.capTable._0_4_);
        pcVar30 = "";
        if (lVar33 != 0) {
          pcVar30 = (char *)CONCAT44(scopes.builder.segment._4_4_,
                                     CONCAT22(scopes.builder.segment._2_2_,
                                              CONCAT11(scopes.builder.segment._1_1_,
                                                       (char)scopes.builder.segment)));
        }
        message_00.content.size_ = lVar33 + (ulong)(lVar33 == 0);
        message_00.content.ptr = pcVar30;
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  (pEVar2,&_decl1554.field_1.value.source,message_00);
      }
      else {
        pEVar2 = this->errorReporter;
        BrandedDecl::toString((String *)&dupDetector,&_decl1554.field_1.value);
        kj::str<char_const(&)[2],kj::String,char_const(&)[79]>
                  ((String *)&scopes,(kj *)0x1f5394,(char (*) [2])&dupDetector,
                   (String *)
                   "\' is an unbound generic parameter. Currently we don\'t support extending these."
                   ,(char (*) [79])in_R8);
        lVar33 = CONCAT44(scopes.builder.capTable._4_4_,scopes.builder.capTable._0_4_);
        pcVar30 = "";
        if (lVar33 != 0) {
          pcVar30 = (char *)CONCAT44(scopes.builder.segment._4_4_,
                                     CONCAT22(scopes.builder.segment._2_2_,
                                              CONCAT11(scopes.builder.segment._1_1_,
                                                       (char)scopes.builder.segment)));
        }
        message.content.size_ = lVar33 + (ulong)(lVar33 == 0);
        message.content.ptr = pcVar30;
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  (pEVar2,&_decl1554.field_1.value.source,message);
      }
      kj::Array<char>::~Array((Array<char> *)&scopes);
      kj::Array<char>::~Array((Array<char> *)&dupDetector);
    }
LAB_00157138:
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&_decl1554);
  }
  methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &methods._M_t._M_impl.super__Rb_tree_header._M_header;
  methods._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  methods._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  methods._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_8f8.segment = (SegmentReader *)&members;
  uVar34 = 0;
  methods._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (local_8f8.capTable._0_4_ = 0; (ListElementCount)local_8f8.capTable != LVar12;
      local_8f8.capTable._0_4_ = (ListElementCount)local_8f8.capTable + 1) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator*((Reader *)&dupDetector,
                (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                 *)&local_8f8);
    if ((0x1f < (uint)dupDetector.lastOrdinalLocation.ptr.field_1._8_4_) &&
       (*(short *)(dupDetector.lastOrdinalLocation.ptr._0_8_ + 2) == 10)) {
      bindings.builder.step._2_2_ = dupDetector.lastOrdinalLocation.ptr.field_1._6_2_;
      bindings.builder._24_6_ = dupDetector.lastOrdinalLocation.ptr.field_1._0_6_;
      bindings.builder.structPointerCount = dupDetector.lastOrdinalLocation.ptr.field_1._12_2_;
      bindings.builder.structDataSize = dupDetector.lastOrdinalLocation.ptr.field_1._8_4_;
      bindings.builder._38_2_ = dupDetector.lastOrdinalLocation.ptr.field_1._14_2_;
      uStack_800._6_1_ = dupDetector.lastOrdinalLocation.ptr.field_1._22_1_;
      uStack_800._0_6_ = dupDetector.lastOrdinalLocation.ptr.field_1._16_6_;
      uStack_800._7_1_ = dupDetector.lastOrdinalLocation.ptr.field_1._23_1_;
      bindings.builder.ptr = (byte *)dupDetector.lastOrdinalLocation.ptr._0_8_;
      bindings.builder.segment = (SegmentBuilder *)dupDetector.errorReporter;
      bindings.builder.capTable = (CapTableBuilder *)dupDetector._8_8_;
      Declaration::Id::Reader::getOrdinal((Reader *)&superclass,(Reader *)&bindings);
      if (superclass._reader.dataSize < 0x40) {
        _decl1554.isSet = false;
        _decl1554._1_7_ = 0;
      }
      else {
        _decl1554._0_8_ = *superclass._reader.data;
      }
      scopes.builder.structPointerCount = dupDetector.lastOrdinalLocation.ptr.field_1._8_2_;
      scopes.builder.elementSize = dupDetector.lastOrdinalLocation.ptr.field_1._10_1_;
      scopes.builder._39_1_ = dupDetector.lastOrdinalLocation.ptr.field_1._11_1_;
      uStack_690 = (undefined4)
                   (CONCAT26(dupDetector.lastOrdinalLocation.ptr.field_1._14_2_,
                             CONCAT24(dupDetector.lastOrdinalLocation.ptr.field_1._12_2_,
                                      dupDetector.lastOrdinalLocation.ptr.field_1._8_4_)) >> 0x20);
      uStack_68c = (undefined4)dupDetector.lastOrdinalLocation.ptr.field_1._16_6_;
      uStack_688 = (undefined4)
                   (CONCAT17(dupDetector.lastOrdinalLocation.ptr.field_1._23_1_,
                             CONCAT16(dupDetector.lastOrdinalLocation.ptr.field_1._22_1_,
                                      dupDetector.lastOrdinalLocation.ptr.field_1._16_6_)) >> 0x20);
      scopes.builder.ptr._4_4_ = dupDetector.lastOrdinalLocation.ptr._0_4_;
      scopes.builder.elementCount = dupDetector.lastOrdinalLocation.ptr._4_4_;
      scopes.builder.step = (BitsPerElementN<23>)dupDetector.lastOrdinalLocation.ptr.field_1._0_6_;
      scopes.builder.structDataSize =
           (StructDataBitCount)
           (CONCAT26(dupDetector.lastOrdinalLocation.ptr.field_1._6_2_,
                     dupDetector.lastOrdinalLocation.ptr.field_1._0_6_) >> 0x20);
      scopes.builder.segment._4_4_ = SUB84(dupDetector.errorReporter,0);
      scopes.builder.capTable._0_4_ = (undefined4)((ulong)dupDetector.errorReporter >> 0x20);
      scopes.builder.capTable._4_4_ = dupDetector.expectedOrdinal;
      scopes.builder.ptr._0_4_ = dupDetector._12_4_;
      _decl1554.field_1._52_4_ = uStack_688;
      _decl1554.field_1._4_4_ =
           CONCAT22(scopes.builder.segment._2_2_,
                    CONCAT11(scopes.builder.segment._1_1_,(char)scopes.builder.segment));
      _decl1554.field_1._36_4_ = scopes.builder.structDataSize;
      _decl1554.field_1._40_4_ = dupDetector.lastOrdinalLocation.ptr.field_1._8_4_;
      _decl1554.field_1._44_4_ = uStack_690;
      _decl1554.field_1._48_4_ = uStack_68c;
      _decl1554.field_1._20_4_ = scopes.builder.ptr._0_4_;
      _decl1554.field_1._24_4_ = scopes.builder.ptr._4_4_;
      _decl1554.field_1._28_4_ = scopes.builder.elementCount;
      _decl1554.field_1._32_4_ = scopes.builder.step;
      _decl1554.field_1._8_4_ = scopes.builder.segment._4_4_;
      _decl1554.field_1._12_4_ = scopes.builder.capTable._0_4_;
      _decl1554.field_1._16_4_ = scopes.builder.capTable._4_4_;
      _decl1554.field_1.value.body.tag = uVar34;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
      ::
      _M_emplace_equal<std::pair<unsigned_long,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
                  *)&methods,
                 (pair<unsigned_long,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>
                  *)&_decl1554);
      uVar34 = uVar34 + 1;
    }
  }
  capnp::schema::Node::Interface::Builder::initMethods
            (&list,&interfaceBuilder,(uint)methods._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  capnp::_::OrphanGetImpl<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::apply
            ((Builder *)&_decl1554,&(this->sourceInfo).builder);
  capnp::schema::Node::SourceInfo::Builder::initMembers
            (&sourceInfoList,(Builder *)&_decl1554,
             (uint)methods._M_t._M_impl.super__Rb_tree_header._M_node_count);
  dupDetector.errorReporter = this->errorReporter;
  dupDetector._8_8_ = dupDetector._8_8_ & 0xffffffff00000000;
  dupDetector.lastOrdinalLocation.ptr._0_8_ =
       dupDetector.lastOrdinalLocation.ptr._0_8_ & 0xffffffffffffff00;
  decl_00 = &_decl1554.field_1.value.source;
  local_830 = &this->orphanage;
  local_8a0 = 0;
  p_Var25 = methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var25 == &methods._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
      ::~_Rb_tree(&methods._M_t);
      return;
    }
    uVar29 = *(undefined4 *)&p_Var25[1]._M_parent;
    levels.builder.ptr = (BrandScope **)p_Var25[1]._M_left;
    levels.builder.pos = (RemoveConst<capnp::compiler::BrandScope_*> *)p_Var25[1]._M_right;
    levels.builder.endPtr = *(BrandScope ***)(p_Var25 + 2);
    levels.builder.disposer = (ArrayDisposer *)p_Var25[2]._M_parent;
    p_Var6 = p_Var25[2]._M_left;
    methodReader._reader.segment = (SegmentReader *)p_Var25[1]._M_left;
    methodReader._reader.capTable = (CapTableReader *)p_Var25[1]._M_right;
    methodReader._reader.data = *(void **)(p_Var25 + 2);
    methodReader._reader.pointers = (WirePointer *)p_Var25[2]._M_parent;
    methodReader._reader._32_8_ = p_Var25[2]._M_left;
    methodReader._reader._40_8_ = p_Var25[2]._M_right;
    _decl1554._0_8_ = p_Var25[1]._M_left;
    _decl1554.field_1._24_4_ = SUB84(p_Var25[2]._M_left,0);
    _decl1554.field_1._28_4_ = (undefined4)((ulong)p_Var25[2]._M_left >> 0x20);
    _decl1554.field_1._32_4_ = SUB84(p_Var25[2]._M_right,0);
    _decl1554.field_1._36_4_ = (undefined4)((ulong)p_Var25[2]._M_right >> 0x20);
    _decl1554.field_1._8_4_ = (undefined4)*(undefined8 *)(p_Var25 + 2);
    _decl1554.field_1._12_4_ = (undefined4)((ulong)*(undefined8 *)(p_Var25 + 2) >> 0x20);
    _decl1554.field_1._16_4_ = SUB84(p_Var25[2]._M_parent,0);
    _decl1554.field_1._20_4_ = (undefined4)((ulong)p_Var25[2]._M_parent >> 0x20);
    _decl1554.field_1.value.body.tag = (uint)p_Var25[1]._M_right;
    _decl1554.field_1._4_4_ = (undefined4)((ulong)p_Var25[1]._M_right >> 0x20);
    Declaration::Id::Reader::getOrdinal(&ordinalDecl,(Reader *)&_decl1554);
    ordinal._reader.pointerCount = ordinalDecl._reader.pointerCount;
    ordinal._reader._38_2_ = ordinalDecl._reader._38_2_;
    ordinal._reader.dataSize = ordinalDecl._reader.dataSize;
    ordinal._reader.capTable = ordinalDecl._reader.capTable;
    ordinal._reader.segment = ordinalDecl._reader.segment;
    ordinal._reader.data = ordinalDecl._reader.data;
    ordinal._reader.pointers = ordinalDecl._reader.pointers;
    ordinal._reader.nestingLimit = ordinalDecl._reader.nestingLimit;
    ordinal._reader._44_4_ = ordinalDecl._reader._44_4_;
    DuplicateOrdinalDetector::check(&dupDetector,ordinal);
    if (ordinalDecl._reader.dataSize < 0x40) {
      methodOrdinal = 0;
    }
    else {
      methodOrdinal = *ordinalDecl._reader.data;
    }
    capnp::_::ListBuilder::getStructElement(&sourceInfo._builder,&sourceInfoList.builder,local_8a0);
    bVar20 = Declaration::Reader::hasDocComment((Reader *)&levels);
    if (bVar20) {
      RVar38 = Declaration::Reader::getDocComment((Reader *)&levels);
      capnp::schema::Node::SourceInfo::Member::Builder::setDocComment(&sourceInfo,RVar38);
    }
    local_7a8 = (uint)p_Var6;
    if (local_7a8 < 0x40) {
      *(undefined4 *)sourceInfo._builder.data = 0;
      ppcVar27 = (char **)0x0;
    }
    else {
      *(undefined4 *)sourceInfo._builder.data = *(undefined4 *)((long)levels.builder.endPtr + 4);
      ppcVar27 = (char **)0x0;
      if (0x5f < local_7a8) {
        ppcVar27 = (char **)(ulong)*(uint *)(levels.builder.endPtr + 1);
      }
    }
    *(int *)((long)sourceInfo._builder.data + 4) = (int)ppcVar27;
    capnp::_::ListBuilder::getStructElement(&methodBuilder._builder,&list.builder,local_8a0);
    Declaration::Reader::getName((Reader *)&_decl1554,(Reader *)&levels);
    RVar38 = LocatedText::Reader::getValue((Reader *)&_decl1554);
    capnp::schema::Method::Builder::setName(&methodBuilder,RVar38);
    *(short *)methodBuilder._builder.data = (short)uVar29;
    Declaration::Reader::getParameters(&implicits,(Reader *)&levels);
    capnp::schema::Method::Builder::initImplicitParameters
              ((Builder *)&implicitsBuilder.builder,&methodBuilder,implicits.reader.elementCount);
    local_8a0 = local_8a0 + 1;
    uVar36 = (ulong)implicits.reader.elementCount;
    for (uVar37 = 0; uVar36 != uVar37; uVar37 = uVar37 + 1) {
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)&scopes,&implicitsBuilder.builder,(ElementCount)uVar37);
      capnp::_::ListReader::getStructElement
                ((StructReader *)&_decl1554,&implicits.reader,(ElementCount)uVar37);
      RVar38 = Declaration::BrandParameter::Reader::getName((Reader *)&_decl1554);
      capnp::schema::Node::Parameter::Builder::setName((Builder *)&scopes,RVar38);
    }
    Declaration::Method::Reader::getParams(&params,&methodReader);
    if ((0xf < params._reader.dataSize) && (*params._reader.data == 2)) {
      ppcVar27 = (char **)0x31;
      message_01.content.size_ = 0x31;
      message_01.content.ptr = "\'stream\' can only appear after \'->\', not before.";
      ErrorReporter::addErrorOn<capnp::compiler::Declaration::ParamList::Reader&>
                (this->errorReporter,&params,message_01);
    }
    Declaration::Reader::getName((Reader *)&results,(Reader *)&levels);
    typeName_1.content._0_16_ = LocatedText::Reader::getValue((Reader *)&results);
    uVar29 = scopes.builder.segment._4_4_;
    sVar1 = scopes.builder.segment._2_2_;
    uVar16 = scopes.builder.segment._1_1_;
    cVar14 = (char)scopes.builder.segment;
    local_868._reader.dataSize = params._reader.dataSize;
    local_868._reader.nestingLimit = params._reader.nestingLimit;
    local_868._reader._44_4_ = params._reader._44_4_;
    local_868._reader.data = params._reader.data;
    local_868._reader.pointers = params._reader.pointers;
    local_868._reader.segment = params._reader.segment;
    local_868._reader.capTable = params._reader.capTable;
    local_8f8.structDataSize = implicits.reader.structDataSize;
    local_8f8.structPointerCount = implicits.reader.structPointerCount;
    local_8f8.elementSize = implicits.reader.elementSize;
    local_8f8._39_1_ = implicits.reader._39_1_;
    local_8f8.nestingLimit = implicits.reader.nestingLimit;
    local_8f8._44_4_ = implicits.reader._44_4_;
    local_8f8.ptr._0_4_ = implicits.reader.ptr._0_4_;
    local_8f8.ptr._4_4_ = implicits.reader.ptr._4_4_;
    local_8f8.elementCount = implicits.reader.elementCount;
    local_8f8.step = implicits.reader.step;
    local_8f8.segment =
         (SegmentReader *)CONCAT44(implicits.reader.segment._4_4_,implicits.reader.segment._0_4_);
    local_8f8.capTable._0_4_ = (ListElementCount)implicits.reader.capTable;
    local_8f8.capTable._4_2_ = implicits.reader.capTable._4_2_;
    local_8f8.capTable._6_1_ = implicits.reader.capTable._6_1_;
    local_8f8.capTable._7_1_ = implicits.reader.capTable._7_1_;
    scopes.builder.segment._0_1_ = (char)this;
    cVar15 = (char)scopes.builder.segment;
    scopes.builder.segment._1_1_ = (undefined1)((ulong)this >> 8);
    uVar17 = scopes.builder.segment._1_1_;
    scopes.builder.segment._2_2_ = (short)((ulong)this >> 0x10);
    sVar18 = scopes.builder.segment._2_2_;
    scopes.builder.segment._4_4_ = (undefined4)((ulong)this >> 0x20);
    uVar19 = scopes.builder.segment._4_4_;
    scopes.builder.segment._0_1_ = cVar14;
    scopes.builder.segment._1_1_ = uVar16;
    scopes.builder.segment._2_2_ = sVar1;
    scopes.builder.segment._4_4_ = uVar29;
    if (params._reader.dataSize < 0x10) {
LAB_0015775a:
      Orphanage::newOrphan<capnp::schema::Node>(&newStruct,local_830);
      Orphanage::newOrphan<capnp::schema::Node::SourceInfo>(&newSourceInfo,local_830);
      capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::apply
                (&builder_1,&newStruct.builder);
      capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::applyReader
                ((Reader *)&superclass,&(this->wipNode).builder);
      _decl1554._0_8_ = anon_var_dwarf_1d726b;
      kj::str<kj::StringPtr&,char_const*>
                (&typeName,(kj *)&typeName_1,(StringPtr *)&_decl1554,ppcVar27);
      if (superclass._reader.dataSize < 0x40) {
        uVar22 = 0;
      }
      else {
        uVar22 = *superclass._reader.data;
      }
      uVar22 = generateMethodParamsId(uVar22,methodOrdinal,false);
      *(uint64_t *)builder_1._builder.data = uVar22;
      RVar38 = capnp::schema::Node::Reader::getDisplayName((Reader *)&superclass);
      scopes.builder.segment._0_1_ = (char)RVar38.super_StringPtr.content.ptr;
      scopes.builder.segment._1_1_ = RVar38.super_StringPtr.content.ptr._1_1_;
      scopes.builder.segment._2_2_ = RVar38.super_StringPtr.content.ptr._2_2_;
      scopes.builder.segment._4_4_ = RVar38.super_StringPtr.content.ptr._4_4_;
      scopes.builder.capTable._0_4_ = (undefined4)RVar38.super_StringPtr.content.size_;
      scopes.builder.capTable._4_4_ = RVar38.super_StringPtr.content.size_._4_4_;
      bindings.builder.segment = (SegmentBuilder *)CONCAT71(bindings.builder.segment._1_7_,0x2e);
      kj::str<capnp::Text::Reader,char,kj::String&>
                ((String *)&_decl1554,(kj *)&scopes,(Reader *)&bindings,(char *)&typeName,in_R8);
      lVar33 = CONCAT44(_decl1554.field_1._4_4_,_decl1554.field_1.value.body.tag);
      pcVar30 = "";
      if (lVar33 != 0) {
        pcVar30 = (char *)_decl1554._0_8_;
      }
      RVar38.super_StringPtr.content.size_ = lVar33 + (ulong)(lVar33 == 0);
      RVar38.super_StringPtr.content.ptr = pcVar30;
      capnp::schema::Node::Builder::setDisplayName(&builder_1,RVar38);
      kj::Array<char>::~Array((Array<char> *)&_decl1554);
      capnp::schema::Node::Builder::getDisplayName((Builder *)&_decl1554,&builder_1);
      uVar26 = 0;
      if (typeName.content.size_ != 0) {
        uVar26 = (int)typeName.content.size_ - 1;
      }
      *(uint *)((long)builder_1._builder.data + 8) = ~uVar26 + _decl1554.field_1._8_4_;
      if ((superclass._reader.dataSize < 0x121) ||
         (bVar20 = true, (*(byte *)((long)superclass._reader.data + 0x24) & 1) == 0)) {
        bVar20 = local_8f8.elementCount != 0;
      }
      *(byte *)((long)builder_1._builder.data + 0x24) =
           *(byte *)((long)builder_1._builder.data + 0x24) & 0xfe | bVar20;
      *(undefined8 *)((long)builder_1._builder.data + 0x10) = 0;
      if (local_868._reader.dataSize < 0x40) {
        *(undefined4 *)((long)builder_1._builder.data + 0x28) = 0;
        uVar29 = 0;
      }
      else {
        *(undefined4 *)((long)builder_1._builder.data + 0x28) =
             *(undefined4 *)((long)local_868._reader.data + 4);
        uVar29 = 0;
        if (0x5f < local_868._reader.dataSize) {
          uVar29 = *(undefined4 *)((long)local_868._reader.data + 8);
        }
      }
      *(undefined4 *)((long)builder_1._builder.data + 0x2c) = uVar29;
      capnp::schema::Node::Builder::initStruct((Builder *)&_decl1554,&builder_1);
      capnp::_::OrphanGetImpl<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::apply
                ((Builder *)&_decl1554,&newSourceInfo.builder);
      puVar9 = (undefined8 *)CONCAT44(_decl1554.field_1._12_4_,_decl1554.field_1._8_4_);
      *puVar9 = *builder_1._builder.data;
      if (local_868._reader.dataSize < 0x40) {
        *(undefined4 *)(puVar9 + 1) = 0;
        uVar29 = 0;
      }
      else {
        *(undefined4 *)(puVar9 + 1) = *(undefined4 *)((long)local_868._reader.data + 4);
        uVar29 = 0;
        if (0x5f < local_868._reader.dataSize) {
          uVar29 = *(undefined4 *)((long)local_868._reader.data + 8);
        }
      }
      *(undefined4 *)((long)puVar9 + 0xc) = uVar29;
      scopes.builder.elementCount = (ListElementCount)local_8f8.segment;
      scopes.builder.step = (BitsPerElementN<23>)((ulong)local_8f8.segment >> 0x20);
      scopes.builder.structDataSize = (ListElementCount)local_8f8.capTable;
      scopes.builder.structPointerCount = local_8f8.capTable._4_2_;
      scopes.builder.elementSize = local_8f8.capTable._6_1_;
      scopes.builder._39_1_ = local_8f8.capTable._7_1_;
      scopes.builder.capTable._0_4_ = SUB84(this->errorReporter,0);
      scopes.builder.capTable._4_4_ = (uint)((ulong)this->errorReporter >> 0x20);
      scopes.builder.ptr._0_4_ = (undefined4)*builder_1._builder.data;
      scopes.builder.ptr._4_4_ = (undefined4)((ulong)*builder_1._builder.data >> 0x20);
      local_670[0]._vptr_StructOrGroup = (_func_int **)&PTR_addVoid_00275290;
      local_670[3]._vptr_StructOrGroup = (_func_int **)0x0;
      local_670[4]._vptr_StructOrGroup = (_func_int **)0x0;
      local_670[1]._vptr_StructOrGroup = (_func_int **)0x0;
      local_670[2]._vptr_StructOrGroup = (_func_int **)0x0;
      scopes.builder.segment._0_1_ = cVar15;
      scopes.builder.segment._1_1_ = uVar17;
      scopes.builder.segment._2_2_ = sVar18;
      scopes.builder.segment._4_4_ = uVar19;
      kj::Arena::Arena(&local_648,0x400);
      local_620._M_color = 0;
      local_620._M_parent = (_Base_ptr)0x0;
      local_5f0 = (RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *)
                  0x0;
      ppMStack_5e8 = (MemberInfo **)0x0;
      local_600 = 0;
      ppMStack_5f8 = (MemberInfo **)0x0;
      local_5e0 = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
      local_620._M_left = &local_620;
      local_620._M_right = &local_620;
      Declaration::ParamList::Reader::getNamedList((Reader *)&bindings,&local_868);
      builder_2._builder.dataSize = builder_1._builder.dataSize;
      builder_2._builder.pointerCount = builder_1._builder.pointerCount;
      builder_2._builder._38_2_ = builder_1._builder._38_2_;
      builder_2._builder.data = builder_1._builder.data;
      builder_2._builder.pointers = builder_1._builder.pointers;
      builder_2._builder.segment = builder_1._builder.segment;
      builder_2._builder.capTable = builder_1._builder.capTable;
      capnp::_::OrphanGetImpl<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::apply
                (&local_2f8,&newSourceInfo.builder);
      implicitBuilder.builder.segment = builder_2._builder.segment;
      implicitBuilder.builder.capTable = builder_2._builder.capTable;
      implicitBuilder.builder.ptr = (byte *)builder_2._builder.data;
      implicitBuilder.builder._24_8_ = builder_2._builder.pointers;
      _decl1554.isSet = false;
      _decl1554._1_7_ = 0;
      _decl1554.field_1.value.body.tag = 0;
      _decl1554.field_1._4_4_ = 0;
      _decl1554.field_1._8_4_ = 0;
      _decl1554.field_1._12_4_ = 0;
      _decl1554.field_1._16_4_ = 0;
      _decl1554.field_1._20_4_ = _decl1554.field_1._20_4_ & 0xffffff00;
      _decl1554.field_1._24_4_ = 0x20b013;
      _decl1554.field_1._28_4_ = 0;
      _decl1554.field_1._32_4_ = 1;
      _decl1554.field_1._36_4_ = 0;
      _decl1554.field_1._56_8_ = 0;
      _decl1554.field_1._64_6_ = 0;
      _decl1554.field_1._40_4_ = 0;
      _decl1554.field_1._44_4_ = 0;
      _decl1554.field_1._48_4_ = 0;
      _decl1554.field_1._52_4_ = 0;
      _decl1554.field_1._70_2_ = 0;
      _decl1554.field_1._72_6_ = 0;
      _decl1554.field_1._80_4_ = 0x7fffffff;
      _decl1554.field_1._90_2_ = 0;
      _decl1554.field_1.value.brand.ptr = (BrandScope *)0x0;
      _decl1554.field_1._120_6_ = 0;
      _decl1554.field_1._126_2_ = 0;
      _decl1554.field_1._128_6_ = 0;
      _decl1554.field_1._96_8_ = 0;
      _decl1554.field_1.value.brand.disposer = (Disposer *)0x0;
      _decl1554.field_1._136_4_ = 0x7fffffff;
      _decl1554.field_1._160_8_ = 0;
      _decl1554.field_1.value.source._reader.pointers = (WirePointer *)0x0;
      _decl1554.field_1._152_8_ = 0;
      implicitBuilder.builder.structDataSize = builder_2._builder.dataSize;
      implicitBuilder.builder.structPointerCount = builder_2._builder.pointerCount;
      implicitBuilder.builder.elementSize = builder_2._builder._38_1_;
      implicitBuilder.builder._39_1_ = builder_2._builder._39_1_;
      params_00.reader.capTable = &(bindings.builder.capTable)->super_CapTableReader;
      params_00.reader.segment = &(bindings.builder.segment)->super_SegmentReader;
      params_00.reader.ptr = bindings.builder.ptr;
      params_00.reader.elementCount = bindings.builder.elementCount;
      params_00.reader.step = bindings.builder.step;
      params_00.reader.structDataSize = bindings.builder.structDataSize;
      params_00.reader.structPointerCount = bindings.builder.structPointerCount;
      params_00.reader.elementSize = bindings.builder.elementSize;
      params_00.reader._39_1_ = bindings.builder._39_1_;
      params_00.reader.nestingLimit = (int)uStack_800;
      params_00.reader._44_4_ = uStack_800._4_4_;
      StructTranslator::traverseParams
                ((StructTranslator *)&scopes,params_00,(MemberInfo *)&_decl1554,local_670);
      builder_00._builder.capTable = implicitBuilder.builder.capTable;
      builder_00._builder.segment = implicitBuilder.builder.segment;
      builder_00._builder.data = implicitBuilder.builder.ptr;
      builder_00._builder.pointers = (WirePointer *)implicitBuilder.builder._24_8_;
      builder_00._builder.dataSize = implicitBuilder.builder.structDataSize;
      builder_00._builder.pointerCount = implicitBuilder.builder.structPointerCount;
      builder_00._builder._38_1_ = implicitBuilder.builder.elementSize;
      builder_00._builder._39_1_ = implicitBuilder.builder._39_1_;
      StructTranslator::translateInternal
                ((StructTranslator *)&scopes,(MemberInfo *)&_decl1554,builder_00);
      StructTranslator::~StructTranslator((StructTranslator *)&scopes);
      local_970 = *builder_1._builder.data;
      _decl1554.field_1.value.body.tag = (uint)newStruct.builder.segment;
      _decl1554.field_1._4_4_ = (undefined4)((ulong)newStruct.builder.segment >> 0x20);
      _decl1554.field_1._8_4_ = SUB84(newStruct.builder.capTable,0);
      _decl1554.field_1._12_4_ = (undefined4)((ulong)newStruct.builder.capTable >> 0x20);
      _decl1554.field_1._16_4_ = (undefined4)newStruct.builder.location._0_6_;
      _decl1554.field_1._20_4_ =
           (undefined4)
           (CONCAT26(newStruct.builder.location._6_2_,newStruct.builder.location._0_6_) >> 0x20);
      newStruct.builder.segment = (SegmentBuilder *)0x0;
      _decl1554._0_8_ = newStruct.builder.tag.content;
      newStruct.builder.location._0_6_ = 0;
      newStruct.builder.location._6_2_ = 0;
      _decl1554.field_1._32_4_ = SUB84(newSourceInfo.builder.segment,0);
      _decl1554.field_1._36_4_ = (undefined4)((ulong)newSourceInfo.builder.segment >> 0x20);
      _decl1554.field_1._40_4_ = SUB84(newSourceInfo.builder.capTable,0);
      _decl1554.field_1._44_4_ = (undefined4)((ulong)newSourceInfo.builder.capTable >> 0x20);
      _decl1554.field_1._48_4_ = SUB84(newSourceInfo.builder.location,0);
      _decl1554.field_1._52_4_ = (undefined4)((ulong)newSourceInfo.builder.location >> 0x20);
      newSourceInfo.builder.segment = (SegmentBuilder *)0x0;
      _decl1554.field_1._24_4_ = (undefined4)newSourceInfo.builder.tag.content;
      _decl1554.field_1._28_4_ = (undefined4)(newSourceInfo.builder.tag.content >> 0x20);
      newSourceInfo.builder.location = (word *)0x0;
      kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::
      add<capnp::compiler::NodeTranslator::AuxNode>(&this->paramStructs,(AuxNode *)&_decl1554);
      AuxNode::~AuxNode((AuxNode *)&_decl1554);
      BrandScope::push((BrandScope *)&brand,(uint64_t)(this->localBrand).ptr,
                       (uint)*builder_1._builder.data);
      uVar37 = (ulong)local_8f8.elementCount;
      if (uVar37 != 0) {
        implicitDecls.ptr =
             kj::_::HeapArrayDisposer::allocateUninitialized<capnp::compiler::BrandedDecl>(uVar37);
        implicitDecls.endPtr = implicitDecls.ptr + uVar37;
        implicitDecls.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        implicitDecls.pos = implicitDecls.ptr;
        capnp::schema::Node::Builder::initParameters
                  (&implicitBuilder,&builder_1,local_8f8.elementCount);
        uVar37 = (ulong)local_8f8.elementCount;
        for (uVar36 = 0; uVar37 != uVar36; uVar36 = uVar36 + 1) {
          EVar35 = (ElementCount)uVar36;
          capnp::_::ListReader::getStructElement((StructReader *)&scopes,&local_8f8,EVar35);
          _decl1554.field_1._128_6_ = 0;
          _decl1554.field_1._134_2_ = 0;
          _decl1554.field_1.value.source._reader.data = (void *)0x0;
          _decl1554.field_1.value.brand.ptr = (BrandScope *)0x0;
          _decl1554.field_1._120_6_ = 0;
          _decl1554.field_1._126_2_ = 0;
          _decl1554.field_1._96_8_ = 0;
          _decl1554.field_1.value.brand.disposer = (Disposer *)0x0;
          _decl1554.field_1.value.source._reader.pointers = (WirePointer *)0x0;
          _decl1554.field_1._152_8_ = 0x7fffffff;
          _decl1554.field_1.value.body.tag = 0;
          _decl1554.field_1._4_4_ = 0;
          _decl1554._0_4_ = 2;
          _decl1554.field_1._8_4_ = EVar35;
          BrandedDecl::BrandedDecl(implicitDecls.pos,(BrandedDecl *)&_decl1554);
          implicitDecls.pos = implicitDecls.pos + 1;
          BrandedDecl::~BrandedDecl((BrandedDecl *)&_decl1554);
          capnp::_::ListBuilder::getStructElement
                    ((StructBuilder *)&_decl1554,&implicitBuilder.builder,EVar35);
          RVar38 = Declaration::BrandParameter::Reader::getName((Reader *)&scopes);
          capnp::schema::Node::Parameter::Builder::setName((Builder *)&_decl1554,RVar38);
        }
        result.size_ = ((long)implicitDecls.pos - (long)implicitDecls.ptr) / 0xa8;
        result.ptr = implicitDecls.ptr;
        result.disposer = implicitDecls.disposer;
        implicitDecls.ptr = (BrandedDecl *)0x0;
        implicitDecls.pos = (RemoveConst<capnp::compiler::BrandedDecl> *)0x0;
        implicitDecls.endPtr = (BrandedDecl *)0x0;
        _decl1554.field_1._24_4_ = 0;
        _decl1554.field_1._28_4_ = 0;
        _decl1554.field_1._36_4_ = 0;
        _decl1554.isSet = false;
        _decl1554._1_7_ = 0;
        _decl1554.field_1.value.body.tag = 0;
        _decl1554.field_1._4_4_ = 0;
        _decl1554.field_1._8_4_ = 0;
        _decl1554.field_1._12_4_ = 0;
        _decl1554.field_1._16_4_ = 0;
        _decl1554.field_1._20_4_ = 0;
        _decl1554.field_1._32_4_ = 0x7fffffff;
        auVar7 = ZEXT1640(ZEXT816(0)) << 0x40;
        source_00._reader._40_8_ = 0x7fffffff;
        source_00._reader.segment = (SegmentReader *)auVar7._0_8_;
        source_00._reader.capTable = (CapTableReader *)auVar7._8_8_;
        source_00._reader.data = (void *)auVar7._16_8_;
        source_00._reader.pointers = (WirePointer *)auVar7._24_8_;
        source_00._reader.dataSize = auVar7._32_4_;
        source_00._reader.pointerCount = auVar7._36_2_;
        source_00._reader._38_2_ = auVar7._38_2_;
        BrandScope::setParams
                  ((BrandScope *)local_2c8,(Array<capnp::compiler::BrandedDecl> *)brand.ptr,
                   (Which)&result,source_00);
        kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose
                  ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_2c8);
        kj::Array<capnp::compiler::BrandedDecl>::~Array(&result);
        kj::ArrayBuilder<capnp::compiler::BrandedDecl>::dispose(&implicitDecls);
      }
      pBVar13 = brand.ptr;
      levels_1.builder.endPtr = (BrandScope **)0x0;
      levels_1.builder.ptr = (BrandScope **)0x0;
      levels_1.builder.pos = (RemoveConst<capnp::compiler::BrandScope_*> *)0x0;
      levels_1.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
      local_9a0 = brand.ptr;
      pBVar23 = brand.ptr;
      do {
        brand_1.disposer = (Disposer *)pBVar23;
        if (((pBVar23->params).size_ != 0) ||
           ((pBVar23->inherited == true && (pBVar23->leafParamCount != 0)))) {
          kj::Vector<capnp::compiler::BrandScope*>::add<capnp::compiler::BrandScope*&>
                    ((Vector<capnp::compiler::BrandScope*> *)&levels_1,(BrandScope **)&brand_1);
        }
        pBVar23 = (BrandScope *)brand_1.disposer[4]._vptr_Disposer;
      } while (pBVar23 != (BrandScope *)0x0);
      if (levels_1.builder.pos != levels_1.builder.ptr) {
        capnp::schema::Method::Builder::initParamBrand((Builder *)&implicitBuilder,&methodBuilder);
        capnp::schema::Brand::Builder::initScopes
                  (&scopes,(Builder *)&implicitBuilder,
                   (uint)((ulong)((long)levels_1.builder.pos - (long)levels_1.builder.ptr) >> 3));
        local_9b0 = (long)levels_1.builder.pos - (long)levels_1.builder.ptr >> 3;
        for (uVar37 = 0; uVar37 != local_9b0; uVar37 = uVar37 + 1) {
          capnp::_::ListBuilder::getStructElement
                    ((StructBuilder *)&implicitBuilder,&scopes.builder,(ElementCount)uVar37);
          pBVar23 = levels_1.builder.ptr[uVar37 & 0xffffffff];
          *(uint64_t *)implicitBuilder.builder.ptr = pBVar23->leafId;
          if (pBVar23->inherited == true) {
            implicitBuilder.builder.ptr[8] = '\x01';
            implicitBuilder.builder.ptr[9] = '\0';
          }
          else {
            capnp::schema::Brand::Scope::Builder::initBind
                      ((Builder *)&implicitDecls,(Builder *)&implicitBuilder,
                       (uint)(pBVar23->params).size_);
            uVar36 = (ulong)implicitDecls.disposer & 0xffffffff;
            EVar35 = 0;
            for (lVar33 = 0; local_9a8 = uVar37, uVar36 * 0xa8 - lVar33 != 0; lVar33 = lVar33 + 0xa8
                ) {
              pBVar32 = (levels_1.builder.ptr[uVar37 & 0xffffffff]->params).ptr;
              pEVar2 = pBVar13->errorReporter;
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)&levels_2,(ListBuilder *)&implicitDecls,EVar35);
              capnp::schema::Brand::Binding::Builder::initType
                        ((Builder *)&implicitDecls_1,(Builder *)&levels_2);
              target_00._builder.capTable = (CapTableBuilder *)implicitDecls_1.pos;
              target_00._builder.segment = (SegmentBuilder *)implicitDecls_1.ptr;
              target_00._builder.data = implicitDecls_1.endPtr;
              target_00._builder.pointers = (WirePointer *)implicitDecls_1.disposer;
              target_00._builder._32_8_ = local_878;
              BrandedDecl::compileAsType
                        ((BrandedDecl *)((long)&(pBVar32->body).tag + lVar33),pEVar2,target_00);
              EVar35 = EVar35 + 1;
            }
          }
        }
      }
      kj::ArrayBuilder<capnp::compiler::BrandScope_*>::dispose(&levels_1.builder);
      kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose(&brand);
      kj::Array<char>::~Array(&typeName.content);
      capnp::_::OrphanBuilder::~OrphanBuilder(&newSourceInfo.builder);
      capnp::_::OrphanBuilder::~OrphanBuilder(&newStruct.builder);
    }
    else {
      sVar1 = *params._reader.data;
      if (sVar1 == 2) {
        (*this->resolver->_vptr_Resolver[8])
                  ((MemberInfo *)&_decl1554,this->resolver,"/capnp/stream.capnp",0x14);
        if (_decl1554.isSet == true) {
          (**(code **)(*(long *)CONCAT44(_decl1554.field_1._36_4_,_decl1554.field_1._32_4_) + 8))
                    ((MemberInfo *)&_decl1554,
                     (long *)CONCAT44(_decl1554.field_1._36_4_,_decl1554.field_1._32_4_),
                     "StreamResult",0xd);
          sVar28 = 0x96;
          pcVar30 = 
          "The version of \'/capnp/stream.capnp\' found in your import path does not appear to be the official one; it is missing the declaration of StreamResult."
          ;
          local_970 = 0x995f9a3377c0b16e;
          if (_decl1554.isSet != false) goto LAB_001586b6;
        }
        else {
          sVar28 = 0xb7;
          pcVar30 = 
          "A method declaration uses streaming, but \'/capnp/stream.capnp\' is not found in the import path. This is a standard file that should always be installed with the Cap\'n Proto compiler."
          ;
        }
        message_02.content.size_ = sVar28;
        message_02.content.ptr = pcVar30;
        ErrorReporter::addErrorOn<capnp::compiler::Declaration::ParamList::Reader&>
                  (this->errorReporter,&local_868,message_02);
        local_970 = 0x995f9a3377c0b16e;
      }
      else {
        if (sVar1 != 1) {
          if (sVar1 != 0) {
            kj::_::unreachable();
          }
          goto LAB_0015775a;
        }
        Declaration::ParamList::Reader::getType((Reader *)&bindings,&local_868);
        superclass._reader.data =
             (void *)CONCAT44(local_8f8.capTable._4_4_,(ListElementCount)local_8f8.capTable);
        superclass._reader.pointers =
             (WirePointer *)CONCAT44(local_8f8.ptr._4_4_,local_8f8.ptr._0_4_);
        superclass._reader._36_4_ = local_8f8.step;
        superclass._reader.dataSize = local_8f8.elementCount;
        superclass._reader._44_2_ = local_8f8.structPointerCount;
        superclass._reader._46_1_ = local_8f8.elementSize;
        superclass._reader._47_1_ = local_8f8._39_1_;
        superclass._reader.nestingLimit = local_8f8.structDataSize;
        auVar10._44_4_ = local_8f8._44_4_;
        auVar10._40_4_ = local_8f8.nestingLimit;
        superclass._reader.capTable = (CapTableReader *)local_8f8.segment;
        superclass._reader.segment = (SegmentReader *)0x0;
        source_01._reader.capTable = &(bindings.builder.capTable)->super_CapTableReader;
        source_01._reader.segment = &(bindings.builder.segment)->super_SegmentReader;
        source_01._reader.data = bindings.builder.ptr;
        source_01._reader.pointers = (WirePointer *)bindings.builder._24_8_;
        source_01._reader.dataSize = bindings.builder.structDataSize;
        source_01._reader.pointerCount = bindings.builder.structPointerCount;
        source_01._reader._38_1_ = bindings.builder.elementSize;
        source_01._reader._39_1_ = bindings.builder._39_1_;
        source_01._reader.nestingLimit = (int)uStack_800;
        source_01._reader._44_4_ = uStack_800._4_4_;
        auVar10._8_8_ = superclass._reader.data;
        auVar10._0_8_ = local_8f8.segment;
        auVar10._16_8_ = superclass._reader.pointers;
        auVar10._24_4_ = local_8f8.elementCount;
        auVar10._28_2_ = (StructPointerCount)local_8f8.step;
        auVar10._30_2_ = (short)(local_8f8.step >> 0x10);
        auVar10._32_8_ = superclass._reader._40_8_;
        auVar10._48_8_ = 0;
        BrandScope::compileDeclExpression
                  ((Maybe<capnp::compiler::BrandedDecl> *)&scopes,(this->localBrand).ptr,source_01,
                   this->resolver,(ImplicitParams)(auVar10 << 0x40));
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                  (&_decl1554,(NullableValue<capnp::compiler::BrandedDecl> *)&scopes);
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                  ((NullableValue<capnp::compiler::BrandedDecl> *)&scopes);
        if (_decl1554.isSet == true) {
          BrandedDecl::getKind(&_decl1554.field_1.value);
          uVar8 = _decl1554.field_1.value.brand.ptr;
          if ((char)scopes.builder.segment != '\x01') {
            message_03.content.size_ = 0x8b;
            message_03.content.ptr =
                 "Cannot use generic parameter as whole input or output of a method. Instead, use a parameter/result list containing a field with this type."
            ;
            ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                      (this->errorReporter,decl_00,message_03);
            goto LAB_001586a2;
          }
          if (scopes.builder.segment._2_2_ != 5) {
            pEVar2 = this->errorReporter;
            Declaration::ParamList::Reader::getType((Reader *)&scopes,&local_868);
            Declaration::ParamList::Reader::getType(&superclass,&local_868);
            name._reader.capTable = (CapTableReader *)local_9a8;
            name._reader.segment = (SegmentReader *)local_9b0;
            name._reader.data = local_9a0;
            name._reader.pointers = (WirePointer *)implicitDecls.ptr;
            name._reader._32_8_ = implicitDecls.pos;
            name._reader._40_8_ = implicitDecls.endPtr;
            expressionString(name);
            kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                      ((String *)&implicitBuilder,(kj *)0x1f5394,(char (*) [2])&implicitDecls,
                       (String *)"\' is not a struct type.",(char (*) [24])in_R8);
            pSVar31 = (SegmentBuilder *)0x20b013;
            if (implicitBuilder.builder.capTable != (CapTableBuilder *)0x0) {
              pSVar31 = implicitBuilder.builder.segment;
            }
            message_04.content.size_ =
                 (long)&((implicitBuilder.builder.capTable)->super_CapTableReader).
                        _vptr_CapTableReader +
                 (ulong)(implicitBuilder.builder.capTable == (CapTableBuilder *)0x0);
            message_04.content.ptr = (char *)pSVar31;
            ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader>
                      (pEVar2,(Reader *)&scopes,message_04);
            kj::Array<char>::~Array((Array<char> *)&implicitBuilder);
            kj::Array<char>::~Array((Array<char> *)&implicitDecls);
            goto LAB_001586a2;
          }
          superclass._reader.segment =
               (SegmentReader *)
               CONCAT71(superclass._reader.segment._1_7_,_decl1554.field_1.value.body.tag == 1);
          if (_decl1554.field_1.value.body.tag != 1) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      ((Fault *)&scopes,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                       ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                       (DebugExpression<bool> *)&superclass);
            kj::_::Debug::Fault::fatal((Fault *)&scopes);
          }
          levels_2.builder.endPtr = (BrandScope **)0x0;
          levels_2.builder.ptr = (BrandScope **)0x0;
          levels_2.builder.pos = (RemoveConst<capnp::compiler::BrandScope_*> *)0x0;
          levels_2.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
          local_9a0 = _decl1554.field_1.value.brand.ptr;
          uVar24 = _decl1554.field_1.value.brand.ptr;
          do {
            builder_1._builder.segment = (SegmentBuilder *)uVar24;
            if (((((BrandScope *)uVar24)->params).size_ != 0) ||
               ((((BrandScope *)uVar24)->inherited == true &&
                (((BrandScope *)uVar24)->leafParamCount != 0)))) {
              kj::Vector<capnp::compiler::BrandScope*>::add<capnp::compiler::BrandScope*&>
                        ((Vector<capnp::compiler::BrandScope*> *)&levels_2,(BrandScope **)&builder_1
                        );
            }
            uVar24 = ((builder_1._builder.segment)->super_SegmentReader).readLimiter;
          } while ((BrandScope *)uVar24 != (BrandScope *)0x0);
          if (levels_2.builder.pos != levels_2.builder.ptr) {
            capnp::schema::Method::Builder::initParamBrand((Builder *)&superclass,&methodBuilder);
            capnp::schema::Brand::Builder::initScopes
                      (&scopes,(Builder *)&superclass,
                       (uint)((ulong)((long)levels_2.builder.pos - (long)levels_2.builder.ptr) >> 3)
                      );
            local_9b0 = (long)levels_2.builder.pos - (long)levels_2.builder.ptr >> 3;
            for (uVar37 = 0; uVar37 != local_9b0; uVar37 = uVar37 + 1) {
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)&superclass,&scopes.builder,(ElementCount)uVar37);
              pBVar23 = levels_2.builder.ptr[uVar37 & 0xffffffff];
              *(uint64_t *)superclass._reader.data = pBVar23->leafId;
              if (pBVar23->inherited == true) {
                *(undefined2 *)((long)superclass._reader.data + 8) = 1;
              }
              else {
                capnp::schema::Brand::Scope::Builder::initBind
                          ((Builder *)&implicitBuilder,(Builder *)&superclass,
                           (uint)(pBVar23->params).size_);
                uVar36 = implicitBuilder.builder._24_8_ & 0xffffffff;
                EVar35 = 0;
                for (lVar33 = 0; local_9a8 = uVar37, uVar36 * 0xa8 - lVar33 != 0;
                    lVar33 = lVar33 + 0xa8) {
                  pBVar32 = (levels_2.builder.ptr[uVar37 & 0xffffffff]->params).ptr;
                  pEVar2 = ((BrandScope *)uVar8)->errorReporter;
                  capnp::_::ListBuilder::getStructElement
                            ((StructBuilder *)&implicitDecls_1,&implicitBuilder.builder,EVar35);
                  capnp::schema::Brand::Binding::Builder::initType
                            ((Builder *)&implicitDecls,(Builder *)&implicitDecls_1);
                  target_01._builder.capTable = (CapTableBuilder *)implicitDecls.pos;
                  target_01._builder.segment = (SegmentBuilder *)implicitDecls.ptr;
                  target_01._builder.data = implicitDecls.endPtr;
                  target_01._builder.pointers = (WirePointer *)implicitDecls.disposer;
                  target_01._builder.dataSize = local_978;
                  target_01._builder.pointerCount = SStack_974;
                  target_01._builder._38_1_ = EStack_972;
                  target_01._builder._39_1_ = uStack_971;
                  BrandedDecl::compileAsType
                            ((BrandedDecl *)((long)&(pBVar32->body).tag + lVar33),pEVar2,target_01);
                  EVar35 = EVar35 + 1;
                }
              }
            }
          }
          kj::ArrayBuilder<capnp::compiler::BrandScope_*>::dispose(&levels_2.builder);
          local_970 = CONCAT44(_decl1554.field_1._12_4_,_decl1554.field_1._8_4_);
        }
        else {
LAB_001586a2:
          local_970 = 0;
        }
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&_decl1554);
      }
    }
LAB_001586b6:
    *(undefined8 *)((long)methodBuilder._builder.data + 8) = local_970;
    results._reader.dataSize = methodReader._reader.dataSize;
    results._reader.pointerCount = methodReader._reader.pointerCount;
    results._reader._38_2_ = methodReader._reader._38_2_;
    uVar8 = results._reader._32_8_;
    results._reader.nestingLimit = methodReader._reader.nestingLimit;
    results._reader._44_4_ = methodReader._reader._44_4_;
    results._reader.data = methodReader._reader.data;
    results._reader.pointers = methodReader._reader.pointers;
    results._reader.segment = methodReader._reader.segment;
    results._reader.capTable = methodReader._reader.capTable;
    newStruct.builder.capTable = (CapTableBuilder *)0x0;
    newStruct.builder.location._0_6_ = 0;
    newStruct.builder.location._6_2_ = 0;
    local_6f8 = 0;
    newStruct.builder.tag.content = 0;
    newStruct.builder.segment = (SegmentBuilder *)0x0;
    results._reader.dataSize = methodReader._reader.dataSize;
    bVar20 = 0x6f < results._reader.dataSize;
    uVar29 = 0x7fffffff;
    results._reader._32_8_ = uVar8;
    if ((bVar20) && (*(short *)((long)methodReader._reader.data + 0xc) == 1)) {
      Declaration::Method::Results::Reader::getExplicit((Reader *)&_decl1554,&results);
      local_6f8 = (undefined6)CONCAT44(_decl1554.field_1._28_4_,_decl1554.field_1._24_4_);
      uStack_6f2 = (undefined2)((uint)_decl1554.field_1._28_4_ >> 0x10);
      newStruct.builder.segment =
           (SegmentBuilder *)CONCAT44(_decl1554.field_1._4_4_,_decl1554.field_1.value.body.tag);
      newStruct.builder.capTable =
           (CapTableBuilder *)CONCAT44(_decl1554.field_1._12_4_,_decl1554.field_1._8_4_);
      newStruct.builder.location._0_6_ =
           (undefined6)CONCAT44(_decl1554.field_1._20_4_,_decl1554.field_1._16_4_);
      newStruct.builder.location._6_2_ = (undefined2)((uint)_decl1554.field_1._20_4_ >> 0x10);
      newStruct.builder.tag.content = _decl1554._0_8_;
      local_734 = _decl1554.field_1._36_4_;
      uVar29 = _decl1554.field_1._32_4_;
    }
    Declaration::Reader::getName((Reader *)&implicitBuilder,(Reader *)&levels);
    local_2c8 = (undefined1  [16])LocatedText::Reader::getValue((Reader *)&implicitBuilder);
    uVar8._6_2_ = uStack_6f2;
    uVar8._0_6_ = local_6f8;
    local_868._reader.pointers =
         (WirePointer *)CONCAT26(newStruct.builder.location._6_2_,newStruct.builder.location._0_6_);
    local_868._reader.data = newStruct.builder.capTable;
    local_868._reader.segment = (SegmentReader *)newStruct.builder.tag.content;
    local_868._reader.capTable = (CapTableReader *)newStruct.builder.segment;
    local_8f8.structDataSize = implicits.reader.structDataSize;
    local_8f8.structPointerCount = implicits.reader.structPointerCount;
    local_8f8.elementSize = implicits.reader.elementSize;
    local_8f8._39_1_ = implicits.reader._39_1_;
    local_8f8.nestingLimit = implicits.reader.nestingLimit;
    local_8f8._44_4_ = implicits.reader._44_4_;
    local_8f8.ptr._0_4_ = implicits.reader.ptr._0_4_;
    local_8f8.ptr._4_4_ = implicits.reader.ptr._4_4_;
    local_8f8.elementCount = implicits.reader.elementCount;
    local_8f8.step = implicits.reader.step;
    local_8f8.segment =
         (SegmentReader *)CONCAT44(implicits.reader.segment._4_4_,implicits.reader.segment._0_4_);
    local_8f8.capTable._0_4_ = (ListElementCount)implicits.reader.capTable;
    local_8f8.capTable._4_2_ = implicits.reader.capTable._4_2_;
    local_8f8.capTable._6_1_ = implicits.reader.capTable._6_1_;
    local_8f8.capTable._7_1_ = implicits.reader.capTable._7_1_;
    ppcVar27 = (char **)(ulong)local_734;
    local_868._reader._44_4_ = local_734;
    local_868._reader.nestingLimit = uVar29;
    local_868._reader.dataSize = (StructDataBitCount)local_6f8;
    local_868._reader._32_8_ = uVar8;
    if (local_868._reader.dataSize < 0x10) {
LAB_0015885d:
      Orphanage::newOrphan<capnp::schema::Node>((Orphan<capnp::schema::Node> *)&typeName,local_830);
      Orphanage::newOrphan<capnp::schema::Node::SourceInfo>
                ((Orphan<capnp::schema::Node::SourceInfo> *)&result,local_830);
      capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::apply
                (&builder_2,(OrphanBuilder *)&typeName);
      capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::applyReader
                ((Reader *)&superclass,&(this->wipNode).builder);
      _decl1554._0_8_ = anon_var_dwarf_1d7260;
      kj::str<kj::StringPtr&,char_const*>
                (&typeName_1,(kj *)local_2c8,(StringPtr *)&_decl1554,ppcVar27);
      if (superclass._reader.dataSize < 0x40) {
        uVar22 = 0;
      }
      else {
        uVar22 = *superclass._reader.data;
      }
      uVar22 = generateMethodParamsId(uVar22,methodOrdinal,true);
      *(uint64_t *)builder_2._builder.data = uVar22;
      RVar38 = capnp::schema::Node::Reader::getDisplayName((Reader *)&superclass);
      scopes.builder.segment._0_1_ = (char)RVar38.super_StringPtr.content.ptr;
      scopes.builder.segment._1_1_ = RVar38.super_StringPtr.content.ptr._1_1_;
      scopes.builder.segment._2_2_ = RVar38.super_StringPtr.content.ptr._2_2_;
      scopes.builder.segment._4_4_ = RVar38.super_StringPtr.content.ptr._4_4_;
      scopes.builder.capTable._0_4_ = (undefined4)RVar38.super_StringPtr.content.size_;
      scopes.builder.capTable._4_4_ = RVar38.super_StringPtr.content.size_._4_4_;
      bindings.builder.segment = (SegmentBuilder *)CONCAT71(bindings.builder.segment._1_7_,0x2e);
      kj::str<capnp::Text::Reader,char,kj::String&>
                ((String *)&_decl1554,(kj *)&scopes,(Reader *)&bindings,(char *)&typeName_1,in_R8);
      lVar33 = CONCAT44(_decl1554.field_1._4_4_,_decl1554.field_1.value.body.tag);
      pcVar30 = "";
      if (lVar33 != 0) {
        pcVar30 = (char *)_decl1554._0_8_;
      }
      value.super_StringPtr.content.size_ = lVar33 + (ulong)(lVar33 == 0);
      value.super_StringPtr.content.ptr = pcVar30;
      capnp::schema::Node::Builder::setDisplayName(&builder_2,value);
      kj::Array<char>::~Array((Array<char> *)&_decl1554);
      capnp::schema::Node::Builder::getDisplayName((Builder *)&_decl1554,&builder_2);
      uVar26 = 0;
      if (typeName_1.content.size_ != 0) {
        uVar26 = (int)typeName_1.content.size_ - 1;
      }
      *(uint *)((long)builder_2._builder.data + 8) = ~uVar26 + _decl1554.field_1._8_4_;
      if ((superclass._reader.dataSize < 0x121) ||
         (bVar20 = true, (*(byte *)((long)superclass._reader.data + 0x24) & 1) == 0)) {
        bVar20 = local_8f8.elementCount != 0;
      }
      *(byte *)((long)builder_2._builder.data + 0x24) =
           *(byte *)((long)builder_2._builder.data + 0x24) & 0xfe | bVar20;
      *(undefined8 *)((long)builder_2._builder.data + 0x10) = 0;
      if (local_868._reader.dataSize < 0x40) {
        *(undefined4 *)((long)builder_2._builder.data + 0x28) = 0;
        uVar29 = 0;
      }
      else {
        *(undefined4 *)((long)builder_2._builder.data + 0x28) =
             *(undefined4 *)
              ((long)&((CapTableReader *)local_868._reader.data)->_vptr_CapTableReader + 4);
        uVar29 = 0;
        if (0x5f < local_868._reader.dataSize) {
          uVar29 = *(undefined4 *)
                    &(((CapTableBuilder *)((long)local_868._reader.data + 8))->super_CapTableReader)
                     ._vptr_CapTableReader;
        }
      }
      *(undefined4 *)((long)builder_2._builder.data + 0x2c) = uVar29;
      capnp::schema::Node::Builder::initStruct((Builder *)&_decl1554,&builder_2);
      capnp::_::OrphanGetImpl<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::apply
                ((Builder *)&_decl1554,(OrphanBuilder *)&result);
      puVar9 = (undefined8 *)CONCAT44(_decl1554.field_1._12_4_,_decl1554.field_1._8_4_);
      *puVar9 = *builder_2._builder.data;
      if (local_868._reader.dataSize < 0x40) {
        *(undefined4 *)(puVar9 + 1) = 0;
        uVar29 = 0;
      }
      else {
        *(undefined4 *)(puVar9 + 1) =
             *(undefined4 *)
              ((long)&((CapTableReader *)local_868._reader.data)->_vptr_CapTableReader + 4);
        uVar29 = 0;
        if (0x5f < local_868._reader.dataSize) {
          uVar29 = *(undefined4 *)
                    &(((CapTableBuilder *)((long)local_868._reader.data + 8))->super_CapTableReader)
                     ._vptr_CapTableReader;
        }
      }
      *(undefined4 *)((long)puVar9 + 0xc) = uVar29;
      scopes.builder.elementCount = (ListElementCount)local_8f8.segment;
      scopes.builder.step = (BitsPerElementN<23>)((ulong)local_8f8.segment >> 0x20);
      scopes.builder.structDataSize = (ListElementCount)local_8f8.capTable;
      scopes.builder.structPointerCount = local_8f8.capTable._4_2_;
      scopes.builder.elementSize = local_8f8.capTable._6_1_;
      scopes.builder._39_1_ = local_8f8.capTable._7_1_;
      scopes.builder.capTable._0_4_ = SUB84(this->errorReporter,0);
      scopes.builder.capTable._4_4_ = (uint)((ulong)this->errorReporter >> 0x20);
      scopes.builder.ptr._0_4_ = (undefined4)*builder_2._builder.data;
      scopes.builder.ptr._4_4_ = (undefined4)((ulong)*builder_2._builder.data >> 0x20);
      local_670[0]._vptr_StructOrGroup = (_func_int **)&PTR_addVoid_00275290;
      local_670[3]._vptr_StructOrGroup = (_func_int **)0x0;
      local_670[4]._vptr_StructOrGroup = (_func_int **)0x0;
      local_670[1]._vptr_StructOrGroup = (_func_int **)0x0;
      local_670[2]._vptr_StructOrGroup = (_func_int **)0x0;
      scopes.builder.segment._0_1_ = cVar15;
      scopes.builder.segment._1_1_ = uVar17;
      scopes.builder.segment._2_2_ = sVar18;
      scopes.builder.segment._4_4_ = uVar19;
      kj::Arena::Arena(&local_648,0x400);
      local_620._M_color = 0;
      local_620._M_parent = (_Base_ptr)0x0;
      local_5f0 = (RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *)
                  0x0;
      ppMStack_5e8 = (MemberInfo **)0x0;
      local_600 = 0;
      ppMStack_5f8 = (MemberInfo **)0x0;
      local_5e0 = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
      local_620._M_left = &local_620;
      local_620._M_right = &local_620;
      Declaration::ParamList::Reader::getNamedList((Reader *)&bindings,&local_868);
      local_2f8._builder.dataSize = builder_2._builder.dataSize;
      local_2f8._builder.pointerCount = builder_2._builder.pointerCount;
      local_2f8._builder._38_2_ = builder_2._builder._38_2_;
      local_2f8._builder.data = builder_2._builder.data;
      local_2f8._builder.pointers = builder_2._builder.pointers;
      local_2f8._builder.segment = builder_2._builder.segment;
      local_2f8._builder.capTable = builder_2._builder.capTable;
      capnp::_::OrphanGetImpl<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::apply
                ((Builder *)&levels_1,(OrphanBuilder *)&result);
      uVar8 = local_2f8._builder._32_8_;
      implicitDecls.ptr = (BrandedDecl *)local_2f8._builder.segment;
      implicitDecls.pos = (RemoveConst<capnp::compiler::BrandedDecl> *)local_2f8._builder.capTable;
      implicitDecls.endPtr = (BrandedDecl *)local_2f8._builder.data;
      implicitDecls.disposer = (ArrayDisposer *)local_2f8._builder.pointers;
      _decl1554.isSet = false;
      _decl1554._1_7_ = 0;
      _decl1554.field_1.value.body.tag = 0;
      _decl1554.field_1._4_4_ = 0;
      _decl1554.field_1._8_4_ = 0;
      _decl1554.field_1._12_4_ = 0;
      _decl1554.field_1._16_4_ = 0;
      _decl1554.field_1._20_4_ = _decl1554.field_1._20_4_ & 0xffffff00;
      _decl1554.field_1._24_4_ = 0x20b013;
      _decl1554.field_1._28_4_ = 0;
      _decl1554.field_1._32_4_ = 1;
      _decl1554.field_1._36_4_ = 0;
      _decl1554.field_1._56_8_ = 0;
      _decl1554.field_1._64_6_ = 0;
      _decl1554.field_1._40_4_ = 0;
      _decl1554.field_1._44_4_ = 0;
      _decl1554.field_1._48_4_ = 0;
      _decl1554.field_1._52_4_ = 0;
      _decl1554.field_1._70_2_ = 0;
      _decl1554.field_1._72_6_ = 0;
      _decl1554.field_1._80_4_ = 0x7fffffff;
      _decl1554.field_1._90_2_ = 0;
      _decl1554.field_1.value.brand.ptr = (BrandScope *)0x0;
      _decl1554.field_1._120_6_ = 0;
      _decl1554.field_1._126_2_ = 0;
      _decl1554.field_1._128_6_ = 0;
      _decl1554.field_1._96_8_ = 0;
      _decl1554.field_1.value.brand.disposer = (Disposer *)0x0;
      _decl1554.field_1._136_4_ = 0x7fffffff;
      _decl1554.field_1._160_8_ = 0;
      _decl1554.field_1.value.source._reader.pointers = (WirePointer *)0x0;
      _decl1554.field_1._152_8_ = 0;
      local_978 = local_2f8._builder.dataSize;
      SStack_974 = local_2f8._builder.pointerCount;
      EStack_972 = local_2f8._builder._38_1_;
      uStack_971 = local_2f8._builder._39_1_;
      params_01.reader.capTable = &(bindings.builder.capTable)->super_CapTableReader;
      params_01.reader.segment = &(bindings.builder.segment)->super_SegmentReader;
      params_01.reader.ptr = bindings.builder.ptr;
      params_01.reader.elementCount = bindings.builder.elementCount;
      params_01.reader.step = bindings.builder.step;
      params_01.reader.structDataSize = bindings.builder.structDataSize;
      params_01.reader.structPointerCount = bindings.builder.structPointerCount;
      params_01.reader.elementSize = bindings.builder.elementSize;
      params_01.reader._39_1_ = bindings.builder._39_1_;
      params_01.reader.nestingLimit = (int)uStack_800;
      params_01.reader._44_4_ = uStack_800._4_4_;
      StructTranslator::traverseParams
                ((StructTranslator *)&scopes,params_01,(MemberInfo *)&_decl1554,local_670);
      uVar24 = local_2f8._builder._32_8_;
      builder_01._builder.capTable = (CapTableBuilder *)implicitDecls.pos;
      builder_01._builder.segment = (SegmentBuilder *)implicitDecls.ptr;
      builder_01._builder.data = implicitDecls.endPtr;
      builder_01._builder.pointers = (WirePointer *)implicitDecls.disposer;
      local_2f8._builder.dataSize = (StructDataBitCount)uVar8;
      local_2f8._builder.pointerCount = SUB82(uVar8,4);
      local_2f8._builder._38_2_ = SUB82(uVar8,6);
      builder_01._builder.dataSize = local_2f8._builder.dataSize;
      builder_01._builder.pointerCount = local_2f8._builder.pointerCount;
      builder_01._builder._38_2_ = local_2f8._builder._38_2_;
      local_2f8._builder._32_8_ = uVar24;
      StructTranslator::translateInternal
                ((StructTranslator *)&scopes,(MemberInfo *)&_decl1554,builder_01);
      StructTranslator::~StructTranslator((StructTranslator *)&scopes);
      local_9b8 = *builder_2._builder.data;
      _decl1554.field_1.value.body.tag = (uint)typeName.content.size_;
      _decl1554.field_1._4_4_ = (undefined4)(typeName.content.size_ >> 0x20);
      _decl1554.field_1._8_4_ = SUB84(typeName.content.disposer,0);
      _decl1554.field_1._12_4_ = (undefined4)((ulong)typeName.content.disposer >> 0x20);
      _decl1554.field_1._16_4_ = SUB84(local_588,0);
      _decl1554.field_1._20_4_ = (undefined4)((ulong)local_588 >> 0x20);
      typeName.content.size_ = 0;
      _decl1554._0_8_ = typeName.content.ptr;
      local_588 = (word *)0x0;
      _decl1554.field_1._32_4_ = (undefined4)result.size_;
      _decl1554.field_1._36_4_ = (undefined4)(result.size_ >> 0x20);
      _decl1554.field_1._40_4_ = SUB84(result.disposer,0);
      _decl1554.field_1._44_4_ = (undefined4)((ulong)result.disposer >> 0x20);
      _decl1554.field_1._48_4_ = SUB84(local_740,0);
      _decl1554.field_1._52_4_ = (undefined4)((ulong)local_740 >> 0x20);
      result.size_ = 0;
      _decl1554.field_1._24_4_ = SUB84(result.ptr,0);
      _decl1554.field_1._28_4_ = (undefined4)((ulong)result.ptr >> 0x20);
      local_740 = (word *)0x0;
      kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::
      add<capnp::compiler::NodeTranslator::AuxNode>(&this->paramStructs,(AuxNode *)&_decl1554);
      AuxNode::~AuxNode((AuxNode *)&_decl1554);
      BrandScope::push((BrandScope *)&brand_1,(uint64_t)(this->localBrand).ptr,
                       (uint)*builder_2._builder.data);
      uVar37 = (ulong)local_8f8.elementCount;
      if (uVar37 != 0) {
        implicitDecls_1.ptr =
             kj::_::HeapArrayDisposer::allocateUninitialized<capnp::compiler::BrandedDecl>(uVar37);
        implicitDecls_1.endPtr = implicitDecls_1.ptr + uVar37;
        implicitDecls_1.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        implicitDecls_1.pos = implicitDecls_1.ptr;
        capnp::schema::Node::Builder::initParameters
                  ((Builder *)&implicitDecls,&builder_2,local_8f8.elementCount);
        uVar37 = (ulong)local_8f8.elementCount;
        for (uVar36 = 0; uVar37 != uVar36; uVar36 = uVar36 + 1) {
          EVar35 = (ElementCount)uVar36;
          capnp::_::ListReader::getStructElement((StructReader *)&scopes,&local_8f8,EVar35);
          _decl1554.field_1._128_6_ = 0;
          _decl1554.field_1._134_2_ = 0;
          _decl1554.field_1.value.source._reader.data = (void *)0x0;
          _decl1554.field_1.value.brand.ptr = (BrandScope *)0x0;
          _decl1554.field_1._120_6_ = 0;
          _decl1554.field_1._126_2_ = 0;
          _decl1554.field_1._96_8_ = 0;
          _decl1554.field_1.value.brand.disposer = (Disposer *)0x0;
          _decl1554.field_1.value.source._reader.pointers = (WirePointer *)0x0;
          _decl1554.field_1._152_8_ = 0x7fffffff;
          _decl1554.field_1.value.body.tag = 0;
          _decl1554.field_1._4_4_ = 0;
          _decl1554._0_4_ = 2;
          _decl1554.field_1._8_4_ = EVar35;
          BrandedDecl::BrandedDecl(implicitDecls_1.pos,(BrandedDecl *)&_decl1554);
          implicitDecls_1.pos = implicitDecls_1.pos + 1;
          BrandedDecl::~BrandedDecl((BrandedDecl *)&_decl1554);
          capnp::_::ListBuilder::getStructElement
                    ((StructBuilder *)&_decl1554,(ListBuilder *)&implicitDecls,EVar35);
          RVar38 = Declaration::BrandParameter::Reader::getName((Reader *)&scopes);
          capnp::schema::Node::Parameter::Builder::setName((Builder *)&_decl1554,RVar38);
        }
        brand.ptr = (BrandScope *)(((long)implicitDecls_1.pos - (long)implicitDecls_1.ptr) / 0xa8);
        brand.disposer = (Disposer *)implicitDecls_1.ptr;
        implicitDecls_1.ptr = (BrandedDecl *)0x0;
        implicitDecls_1.pos = (RemoveConst<capnp::compiler::BrandedDecl> *)0x0;
        implicitDecls_1.endPtr = (BrandedDecl *)0x0;
        _decl1554.field_1._24_4_ = 0;
        _decl1554.field_1._28_4_ = 0;
        _decl1554.field_1._36_4_ = 0;
        _decl1554.isSet = false;
        _decl1554._1_7_ = 0;
        _decl1554.field_1.value.body.tag = 0;
        _decl1554.field_1._4_4_ = 0;
        _decl1554.field_1._8_4_ = 0;
        _decl1554.field_1._12_4_ = 0;
        _decl1554.field_1._16_4_ = 0;
        _decl1554.field_1._20_4_ = 0;
        _decl1554.field_1._32_4_ = 0x7fffffff;
        auVar7 = ZEXT1640(ZEXT816(0)) << 0x40;
        source_02._reader._40_8_ = 0x7fffffff;
        source_02._reader.segment = (SegmentReader *)auVar7._0_8_;
        source_02._reader.capTable = (CapTableReader *)auVar7._8_8_;
        source_02._reader.data = (void *)auVar7._16_8_;
        source_02._reader.pointers = (WirePointer *)auVar7._24_8_;
        source_02._reader.dataSize = auVar7._32_4_;
        source_02._reader.pointerCount = auVar7._36_2_;
        source_02._reader._38_2_ = auVar7._38_2_;
        BrandScope::setParams
                  ((BrandScope *)local_138,(Array<capnp::compiler::BrandedDecl> *)brand_1.ptr,
                   (Which)&brand,source_02);
        kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose
                  ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_138);
        kj::Array<capnp::compiler::BrandedDecl>::~Array
                  ((Array<capnp::compiler::BrandedDecl> *)&brand);
        kj::ArrayBuilder<capnp::compiler::BrandedDecl>::dispose(&implicitDecls_1);
      }
      pBVar13 = brand_1.ptr;
      newSourceInfo.builder.capTable = (CapTableBuilder *)0x0;
      newSourceInfo.builder.tag.content = 0;
      newSourceInfo.builder.segment = (SegmentBuilder *)0x0;
      newSourceInfo.builder.location = (word *)&kj::NullArrayDisposer::instance;
      local_9a0 = brand_1.ptr;
      pBVar23 = brand_1.ptr;
      do {
        local_530 = pBVar23;
        if (((pBVar23->params).size_ != 0) ||
           ((pBVar23->inherited == true && (pBVar23->leafParamCount != 0)))) {
          kj::Vector<capnp::compiler::BrandScope*>::add<capnp::compiler::BrandScope*&>
                    ((Vector<capnp::compiler::BrandScope*> *)&newSourceInfo,&local_530);
        }
        pBVar23 = (local_530->parent).ptr.ptr;
      } while (pBVar23 != (BrandScope *)0x0);
      if (newSourceInfo.builder.segment != (SegmentBuilder *)newSourceInfo.builder.tag.content) {
        capnp::schema::Method::Builder::initResultBrand((Builder *)&implicitDecls,&methodBuilder);
        capnp::schema::Brand::Builder::initScopes
                  (&scopes,(Builder *)&implicitDecls,
                   (uint)((long)newSourceInfo.builder.segment - newSourceInfo.builder.tag.content >>
                         3));
        local_9b0 = (long)((long)newSourceInfo.builder.segment - newSourceInfo.builder.tag.content)
                    >> 3;
        for (uVar37 = 0; uVar37 != local_9b0; uVar37 = uVar37 + 1) {
          capnp::_::ListBuilder::getStructElement
                    ((StructBuilder *)&implicitDecls,&scopes.builder,(ElementCount)uVar37);
          lVar33 = *(long *)(newSourceInfo.builder.tag.content + (uVar37 & 0xffffffff) * 8);
          *(undefined8 *)&(implicitDecls.endPtr)->body = *(undefined8 *)(lVar33 + 0x28);
          if (*(char *)(lVar33 + 0x34) == '\x01') {
            *(undefined2 *)&((implicitDecls.endPtr)->body).field_1 = 1;
          }
          else {
            capnp::schema::Brand::Scope::Builder::initBind
                      ((Builder *)&implicitDecls_1,(Builder *)&implicitDecls,
                       *(uint *)(lVar33 + 0x40));
            uVar36 = (ulong)implicitDecls_1.disposer & 0xffffffff;
            EVar35 = 0;
            for (lVar33 = 0; local_9a8 = uVar37, uVar36 * 0xa8 - lVar33 != 0; lVar33 = lVar33 + 0xa8
                ) {
              lVar3 = *(long *)(*(long *)(newSourceInfo.builder.tag.content +
                                         (uVar37 & 0xffffffff) * 8) + 0x38);
              pEVar2 = pBVar13->errorReporter;
              capnp::_::ListBuilder::getStructElement
                        (&builder_1._builder,(ListBuilder *)&implicitDecls_1,EVar35);
              capnp::schema::Brand::Binding::Builder::initType
                        ((Builder *)&levels_2,(Builder *)&builder_1);
              target_02._builder.capTable = (CapTableBuilder *)levels_2.builder.pos;
              target_02._builder.segment = (SegmentBuilder *)levels_2.builder.ptr;
              target_02._builder.data = levels_2.builder.endPtr;
              target_02._builder.pointers = (WirePointer *)levels_2.builder.disposer;
              target_02._builder._32_8_ = local_7d8;
              BrandedDecl::compileAsType((BrandedDecl *)(lVar3 + lVar33),pEVar2,target_02);
              EVar35 = EVar35 + 1;
            }
          }
        }
      }
      kj::ArrayBuilder<capnp::compiler::BrandScope_*>::dispose
                ((ArrayBuilder<capnp::compiler::BrandScope_*> *)&newSourceInfo);
      kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose(&brand_1);
      kj::Array<char>::~Array(&typeName_1.content);
      capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&result);
      capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&typeName);
    }
    else {
      sVar1 = *(short *)&((newStruct.builder.capTable)->super_CapTableReader)._vptr_CapTableReader;
      if (sVar1 == 2) {
        (*this->resolver->_vptr_Resolver[8])
                  ((MemberInfo *)&_decl1554,this->resolver,"/capnp/stream.capnp",0x14);
        if (_decl1554.isSet == true) {
          (**(code **)(*(long *)CONCAT44(_decl1554.field_1._36_4_,_decl1554.field_1._32_4_) + 8))
                    ((MemberInfo *)&_decl1554,
                     (long *)CONCAT44(_decl1554.field_1._36_4_,_decl1554.field_1._32_4_),
                     "StreamResult",0xd);
          sVar28 = 0x96;
          pcVar30 = 
          "The version of \'/capnp/stream.capnp\' found in your import path does not appear to be the official one; it is missing the declaration of StreamResult."
          ;
          local_9b8 = 0x995f9a3377c0b16e;
          if (_decl1554.isSet != false) goto LAB_001597ae;
        }
        else {
          sVar28 = 0xb7;
          pcVar30 = 
          "A method declaration uses streaming, but \'/capnp/stream.capnp\' is not found in the import path. This is a standard file that should always be installed with the Cap\'n Proto compiler."
          ;
        }
        message_05.content.size_ = sVar28;
        message_05.content.ptr = pcVar30;
        ErrorReporter::addErrorOn<capnp::compiler::Declaration::ParamList::Reader&>
                  (this->errorReporter,&local_868,message_05);
        local_9b8 = 0x995f9a3377c0b16e;
      }
      else {
        if (sVar1 != 1) {
          if (sVar1 != 0) {
            kj::_::unreachable();
          }
          goto LAB_0015885d;
        }
        Declaration::ParamList::Reader::getType((Reader *)&bindings,&local_868);
        superclass._reader.data =
             (void *)CONCAT44(local_8f8.capTable._4_4_,(ListElementCount)local_8f8.capTable);
        superclass._reader.pointers =
             (WirePointer *)CONCAT44(local_8f8.ptr._4_4_,local_8f8.ptr._0_4_);
        superclass._reader._36_4_ = local_8f8.step;
        superclass._reader.dataSize = local_8f8.elementCount;
        superclass._reader._44_2_ = local_8f8.structPointerCount;
        superclass._reader._46_1_ = local_8f8.elementSize;
        superclass._reader._47_1_ = local_8f8._39_1_;
        superclass._reader.nestingLimit = local_8f8.structDataSize;
        auVar11._44_4_ = local_8f8._44_4_;
        auVar11._40_4_ = local_8f8.nestingLimit;
        superclass._reader.capTable = (CapTableReader *)local_8f8.segment;
        superclass._reader.segment = (SegmentReader *)0x0;
        source_03._reader.capTable = &(bindings.builder.capTable)->super_CapTableReader;
        source_03._reader.segment = &(bindings.builder.segment)->super_SegmentReader;
        source_03._reader.data = bindings.builder.ptr;
        source_03._reader.pointers = (WirePointer *)bindings.builder._24_8_;
        source_03._reader.dataSize = bindings.builder.structDataSize;
        source_03._reader.pointerCount = bindings.builder.structPointerCount;
        source_03._reader._38_1_ = bindings.builder.elementSize;
        source_03._reader._39_1_ = bindings.builder._39_1_;
        source_03._reader.nestingLimit = (int)uStack_800;
        source_03._reader._44_4_ = uStack_800._4_4_;
        auVar11._8_8_ = superclass._reader.data;
        auVar11._0_8_ = local_8f8.segment;
        auVar11._16_8_ = superclass._reader.pointers;
        auVar11._24_4_ = local_8f8.elementCount;
        auVar11._28_2_ = (StructPointerCount)local_8f8.step;
        auVar11._30_2_ = (short)(local_8f8.step >> 0x10);
        auVar11._32_8_ = superclass._reader._40_8_;
        auVar11._48_8_ = 0;
        BrandScope::compileDeclExpression
                  ((Maybe<capnp::compiler::BrandedDecl> *)&scopes,(this->localBrand).ptr,source_03,
                   this->resolver,(ImplicitParams)(auVar11 << 0x40));
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                  (&_decl1554,(NullableValue<capnp::compiler::BrandedDecl> *)&scopes);
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                  ((NullableValue<capnp::compiler::BrandedDecl> *)&scopes);
        if (_decl1554.isSet == true) {
          BrandedDecl::getKind(&_decl1554.field_1.value);
          uVar8 = _decl1554.field_1.value.brand.ptr;
          if ((char)scopes.builder.segment != '\x01') {
            message_06.content.size_ = 0x8b;
            message_06.content.ptr =
                 "Cannot use generic parameter as whole input or output of a method. Instead, use a parameter/result list containing a field with this type."
            ;
            ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                      (this->errorReporter,decl_00,message_06);
            goto LAB_0015979d;
          }
          if (scopes.builder.segment._2_2_ != 5) {
            pEVar2 = this->errorReporter;
            Declaration::ParamList::Reader::getType((Reader *)&scopes,&local_868);
            Declaration::ParamList::Reader::getType(&superclass,&local_868);
            name_00._reader.capTable = (CapTableReader *)local_9a8;
            name_00._reader.segment = (SegmentReader *)local_9b0;
            name_00._reader.data = local_9a0;
            name_00._reader.pointers = (WirePointer *)implicitDecls.ptr;
            name_00._reader._32_8_ = implicitDecls.pos;
            name_00._reader._40_8_ = implicitDecls.endPtr;
            expressionString(name_00);
            kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                      ((String *)&implicitDecls,(kj *)0x1f5394,(char (*) [2])&implicitDecls_1,
                       (String *)"\' is not a struct type.",(char (*) [24])in_R8);
            pBVar32 = (BrandedDecl *)0x20b013;
            if (implicitDecls.pos != (RemoveConst<capnp::compiler::BrandedDecl> *)0x0) {
              pBVar32 = implicitDecls.ptr;
            }
            message_07.content.size_ =
                 (long)&((implicitDecls.pos)->body).tag +
                 (ulong)(implicitDecls.pos == (RemoveConst<capnp::compiler::BrandedDecl> *)0x0);
            message_07.content.ptr = (char *)pBVar32;
            ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader>
                      (pEVar2,(Reader *)&scopes,message_07);
            kj::Array<char>::~Array((Array<char> *)&implicitDecls);
            kj::Array<char>::~Array((Array<char> *)&implicitDecls_1);
            goto LAB_0015979d;
          }
          superclass._reader.segment =
               (SegmentReader *)
               CONCAT71(superclass._reader.segment._1_7_,_decl1554.field_1.value.body.tag == 1);
          if (_decl1554.field_1.value.body.tag != 1) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      ((Fault *)&scopes,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
                       ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
                       (DebugExpression<bool> *)&superclass);
            kj::_::Debug::Fault::fatal((Fault *)&scopes);
          }
          builder_1._builder.data = (void *)0x0;
          builder_1._builder.segment = (SegmentBuilder *)0x0;
          builder_1._builder.capTable = (CapTableBuilder *)0x0;
          builder_1._builder.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
          local_9a0 = _decl1554.field_1.value.brand.ptr;
          uVar24 = _decl1554.field_1.value.brand.ptr;
          do {
            builder_2._builder.segment = (SegmentBuilder *)uVar24;
            if (((((BrandScope *)uVar24)->params).size_ != 0) ||
               ((((BrandScope *)uVar24)->inherited == true &&
                (((BrandScope *)uVar24)->leafParamCount != 0)))) {
              kj::Vector<capnp::compiler::BrandScope*>::add<capnp::compiler::BrandScope*&>
                        ((Vector<capnp::compiler::BrandScope*> *)&builder_1,
                         (BrandScope **)&builder_2);
            }
            uVar24 = ((builder_2._builder.segment)->super_SegmentReader).readLimiter;
          } while ((BrandScope *)uVar24 != (BrandScope *)0x0);
          if ((SegmentBuilder *)builder_1._builder.capTable != builder_1._builder.segment) {
            capnp::schema::Method::Builder::initResultBrand((Builder *)&superclass,&methodBuilder);
            capnp::schema::Brand::Builder::initScopes
                      (&scopes,(Builder *)&superclass,
                       (uint)((ulong)((long)builder_1._builder.capTable -
                                     (long)builder_1._builder.segment) >> 3));
            local_9b0 = (long)builder_1._builder.capTable - (long)builder_1._builder.segment >> 3;
            for (uVar37 = 0; uVar37 != local_9b0; uVar37 = uVar37 + 1) {
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)&superclass,&scopes.builder,(ElementCount)uVar37);
              pAVar4 = (&((builder_1._builder.segment)->super_SegmentReader).arena)
                       [uVar37 & 0xffffffff];
              *(_func_int ***)superclass._reader.data = pAVar4[5]._vptr_Arena;
              if (*(char *)((long)&pAVar4[6]._vptr_Arena + 4) == '\x01') {
                *(undefined2 *)((long)superclass._reader.data + 8) = 1;
              }
              else {
                capnp::schema::Brand::Scope::Builder::initBind
                          ((Builder *)&implicitDecls,(Builder *)&superclass,
                           *(uint *)&pAVar4[8]._vptr_Arena);
                uVar36 = (ulong)implicitDecls.disposer & 0xffffffff;
                EVar35 = 0;
                for (lVar33 = 0; local_9a8 = uVar37, uVar36 * 0xa8 - lVar33 != 0;
                    lVar33 = lVar33 + 0xa8) {
                  pp_Var5 = (&((builder_1._builder.segment)->super_SegmentReader).arena)
                            [uVar37 & 0xffffffff][7]._vptr_Arena;
                  pEVar2 = ((BrandScope *)uVar8)->errorReporter;
                  capnp::_::ListBuilder::getStructElement
                            ((StructBuilder *)&levels_2,(ListBuilder *)&implicitDecls,EVar35);
                  capnp::schema::Brand::Binding::Builder::initType
                            ((Builder *)&implicitDecls_1,(Builder *)&levels_2);
                  target_03._builder.capTable = (CapTableBuilder *)implicitDecls_1.pos;
                  target_03._builder.segment = (SegmentBuilder *)implicitDecls_1.ptr;
                  target_03._builder.data = implicitDecls_1.endPtr;
                  target_03._builder.pointers = (WirePointer *)implicitDecls_1.disposer;
                  target_03._builder._32_8_ = local_878;
                  BrandedDecl::compileAsType
                            ((BrandedDecl *)((long)pp_Var5 + lVar33),pEVar2,target_03);
                  EVar35 = EVar35 + 1;
                }
              }
            }
          }
          kj::ArrayBuilder<capnp::compiler::BrandScope_*>::dispose
                    ((ArrayBuilder<capnp::compiler::BrandScope_*> *)&builder_1);
          local_9b8 = CONCAT44(_decl1554.field_1._12_4_,_decl1554.field_1._8_4_);
        }
        else {
LAB_0015979d:
          local_9b8 = 0;
        }
        kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue(&_decl1554);
      }
    }
LAB_001597ae:
    *(undefined8 *)((long)methodBuilder._builder.data + 0x10) = local_9b8;
    Declaration::Reader::getAnnotations(&local_168,(Reader *)&levels);
    annotations.reader.capTable = local_168.reader.capTable;
    annotations.reader.segment = local_168.reader.segment;
    annotations.reader.ptr = local_168.reader.ptr;
    annotations.reader.elementCount = local_168.reader.elementCount;
    annotations.reader.step = local_168.reader.step;
    annotations.reader.structDataSize = local_168.reader.structDataSize;
    annotations.reader.structPointerCount = local_168.reader.structPointerCount;
    annotations.reader.elementSize = local_168.reader.elementSize;
    annotations.reader._39_1_ = local_168.reader._39_1_;
    annotations.reader.nestingLimit = local_168.reader.nestingLimit;
    annotations.reader._44_4_ = local_168.reader._44_4_;
    targetsFlagName.content.size_ = 0xe;
    targetsFlagName.content.ptr = "targetsMethod";
    compileAnnotationApplications
              ((Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)&_decl1554,this,
               annotations,targetsFlagName);
    capnp::schema::Method::Builder::adoptAnnotations
              (&methodBuilder,
               (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)&_decl1554);
    capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&_decl1554);
    p_Var25 = (_Base_ptr)std::_Rb_tree_increment(p_Var25);
  } while( true );
}

Assistant:

void NodeTranslator::compileInterface(Declaration::Interface::Reader decl,
                                      List<Declaration>::Reader members,
                                      schema::Node::Builder builder) {
  auto interfaceBuilder = builder.initInterface();

  auto superclassesDecl = decl.getSuperclasses();
  auto superclassesBuilder = interfaceBuilder.initSuperclasses(superclassesDecl.size());
  for (uint i: kj::indices(superclassesDecl)) {
    auto superclass = superclassesDecl[i];

    KJ_IF_SOME(decl, compileDeclExpression(superclass, ImplicitParams::none())) {
      KJ_IF_SOME(kind, decl.getKind()) {
        if (kind == Declaration::INTERFACE) {
          auto s = superclassesBuilder[i];
          s.setId(decl.getIdAndFillBrand([&]() { return s.initBrand(); }));
        } else {
          decl.addError(errorReporter, kj::str(
            "'", decl.toString(), "' is not an interface."));
        }
      } else {
        // A variable?
        decl.addError(errorReporter, kj::str(
            "'", decl.toString(), "' is an unbound generic parameter. Currently we don't support "
            "extending these."));
      }
    }
  }